

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O2

bool embree::sse2::CurveNiMBIntersector1<4>::
     occluded_n<embree::sse2::OrientedCurve1Intersector1<embree::BezierCurveT,3,4>,embree::sse2::Occluded1Epilog1<true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  long lVar1;
  long lVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  Primitive *pPVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  ulong uVar14;
  Primitive PVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  Geometry *pGVar24;
  __int_type_conflict _Var25;
  long lVar26;
  long lVar27;
  long lVar28;
  bool bVar29;
  bool bVar30;
  undefined1 auVar31 [12];
  undefined1 auVar32 [12];
  undefined1 auVar33 [12];
  undefined1 auVar34 [12];
  undefined1 auVar35 [12];
  undefined1 auVar36 [12];
  undefined3 uVar37;
  undefined1 auVar38 [12];
  undefined1 auVar39 [12];
  undefined1 auVar40 [15];
  undefined1 auVar41 [15];
  undefined1 auVar42 [15];
  undefined1 auVar43 [15];
  undefined1 auVar44 [15];
  undefined1 auVar45 [15];
  undefined1 auVar46 [15];
  undefined1 auVar47 [15];
  undefined1 auVar48 [15];
  undefined1 auVar49 [15];
  undefined1 auVar50 [15];
  undefined1 auVar51 [15];
  undefined1 auVar52 [15];
  undefined1 auVar53 [15];
  undefined1 auVar54 [15];
  undefined1 auVar55 [15];
  undefined1 auVar56 [15];
  undefined1 auVar57 [15];
  undefined1 auVar58 [15];
  undefined1 auVar59 [15];
  undefined1 auVar60 [15];
  undefined1 auVar61 [15];
  undefined1 auVar62 [15];
  undefined1 auVar63 [15];
  undefined1 auVar64 [15];
  undefined1 auVar65 [15];
  undefined1 auVar66 [15];
  undefined1 auVar67 [15];
  undefined1 auVar68 [15];
  undefined1 auVar69 [15];
  undefined1 auVar70 [15];
  unkbyte9 Var71;
  undefined1 auVar72 [11];
  undefined1 auVar73 [13];
  undefined1 auVar74 [12];
  undefined1 auVar75 [13];
  undefined1 auVar76 [12];
  undefined1 auVar77 [13];
  undefined1 auVar78 [12];
  undefined1 auVar79 [13];
  undefined1 auVar80 [12];
  undefined1 auVar81 [12];
  undefined6 uVar82;
  undefined1 auVar83 [12];
  undefined1 auVar84 [12];
  undefined1 auVar85 [12];
  undefined1 auVar86 [12];
  undefined1 auVar87 [12];
  undefined1 auVar88 [12];
  undefined1 auVar89 [12];
  undefined1 auVar90 [12];
  undefined1 auVar91 [12];
  undefined1 auVar92 [12];
  undefined1 auVar93 [15];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [15];
  undefined1 auVar97 [15];
  undefined1 auVar98 [15];
  undefined1 auVar99 [15];
  undefined1 auVar100 [15];
  undefined1 auVar101 [15];
  undefined1 auVar102 [13];
  undefined1 auVar103 [15];
  byte bVar104;
  ulong uVar105;
  ulong uVar106;
  RTCFilterFunctionN p_Var107;
  ulong uVar108;
  undefined4 uVar109;
  undefined8 unaff_RBP;
  long lVar111;
  long lVar112;
  byte bVar113;
  bool bVar114;
  uint uVar115;
  uint uVar116;
  uint uVar117;
  uint uVar118;
  float fVar119;
  undefined2 uVar146;
  float fVar148;
  undefined1 auVar120 [12];
  float fVar147;
  vfloat_impl<4> p00;
  undefined1 auVar121 [16];
  undefined1 auVar123 [16];
  undefined1 auVar126 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  short sVar149;
  int iVar150;
  undefined1 auVar152 [12];
  int iVar185;
  undefined1 in_XMM1 [16];
  undefined1 auVar154 [16];
  char cVar188;
  undefined1 auVar158 [16];
  undefined1 auVar162 [16];
  undefined1 auVar153 [12];
  undefined1 auVar166 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined8 extraout_XMM1_Qb;
  undefined8 extraout_XMM1_Qb_00;
  undefined1 auVar184 [16];
  char cVar189;
  char cVar214;
  float t1;
  float fVar190;
  float fVar191;
  undefined2 uVar215;
  float fVar216;
  float fVar218;
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined2 uVar217;
  undefined1 auVar195 [16];
  undefined1 auVar198 [16];
  undefined1 auVar201 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  char cVar228;
  float fVar219;
  float fVar220;
  float fVar229;
  float fVar231;
  undefined1 auVar223 [16];
  float fVar230;
  float fVar232;
  float fVar233;
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar234 [12];
  vfloat4 a;
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar240 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  float fVar255;
  float fVar266;
  float fVar267;
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  float fVar269;
  undefined1 auVar268 [16];
  undefined1 auVar270 [12];
  float fVar289;
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar271 [12];
  undefined1 auVar277 [16];
  undefined1 auVar281 [16];
  float fVar290;
  float fVar291;
  float fVar292;
  float fVar293;
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  float fVar294;
  float fVar295;
  undefined1 uVar307;
  float fVar308;
  float fVar310;
  undefined1 auVar296 [16];
  float fVar309;
  float fVar311;
  float fVar312;
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  float fVar313;
  float fVar329;
  float fVar332;
  undefined1 auVar316 [12];
  undefined1 auVar317 [16];
  float fVar314;
  float fVar315;
  undefined1 auVar321 [16];
  float fVar330;
  float fVar331;
  float fVar333;
  float fVar334;
  float fVar335;
  float fVar336;
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  undefined1 auVar326 [16];
  undefined1 auVar327 [16];
  undefined1 auVar328 [16];
  float fVar337;
  float fVar338;
  float fVar345;
  float fVar349;
  vfloat4 a_1;
  undefined1 auVar339 [16];
  float fVar346;
  float fVar347;
  float fVar348;
  float fVar350;
  float fVar351;
  float fVar352;
  float fVar353;
  float fVar354;
  float fVar355;
  float fVar356;
  undefined1 auVar340 [16];
  undefined1 auVar341 [16];
  undefined1 auVar342 [16];
  undefined1 auVar343 [16];
  undefined1 auVar344 [16];
  float fVar357;
  float fVar358;
  float fVar365;
  float fVar367;
  vfloat4 a_2;
  undefined1 auVar359 [16];
  float fVar366;
  float fVar368;
  float fVar369;
  undefined1 auVar360 [16];
  undefined1 auVar361 [16];
  undefined1 auVar362 [16];
  undefined1 auVar363 [16];
  undefined1 auVar364 [16];
  float fVar370;
  float fVar371;
  float fVar379;
  float fVar381;
  undefined1 auVar372 [16];
  undefined1 auVar375 [16];
  float fVar380;
  float fVar382;
  float fVar383;
  undefined1 auVar376 [16];
  undefined1 auVar377 [16];
  undefined1 auVar378 [16];
  float fVar384;
  float fVar392;
  float fVar393;
  undefined1 auVar385 [16];
  float fVar394;
  undefined1 auVar388 [16];
  undefined1 auVar389 [16];
  undefined1 auVar390 [16];
  undefined1 auVar391 [16];
  float fVar395;
  float fVar401;
  float fVar402;
  float fVar403;
  undefined1 auVar396 [16];
  undefined1 auVar397 [16];
  undefined1 auVar398 [16];
  undefined1 auVar399 [16];
  undefined1 auVar400 [16];
  float fVar404;
  float fVar410;
  float fVar411;
  undefined1 auVar405 [16];
  float fVar412;
  undefined1 auVar408 [16];
  undefined1 auVar409 [16];
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  vfloat_impl<4> p00_1;
  RTCFilterFunctionNArguments args;
  uint mask_stack [4];
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  undefined1 local_418 [8];
  float fStack_410;
  float fStack_40c;
  undefined8 local_408;
  undefined1 local_3f8 [8];
  float fStack_3f0;
  float fStack_3ec;
  undefined4 local_3cc;
  float local_3c8;
  float fStack_3c4;
  float fStack_3c0;
  float fStack_3bc;
  float local_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float local_3a8;
  float fStack_3a4;
  float fStack_3a0;
  float fStack_39c;
  float local_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float local_388;
  float fStack_384;
  float fStack_380;
  float fStack_37c;
  float local_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float local_368;
  float fStack_364;
  float fStack_360;
  float fStack_35c;
  undefined1 local_358 [8];
  float fStack_350;
  float fStack_34c;
  undefined8 local_348;
  undefined8 uStack_340;
  undefined1 local_338 [16];
  undefined1 local_328 [16];
  undefined1 local_318 [8];
  float fStack_310;
  float fStack_30c;
  float local_308;
  float fStack_304;
  float fStack_300;
  float fStack_2fc;
  undefined1 local_2f8 [8];
  float fStack_2f0;
  float fStack_2ec;
  float local_2e8;
  float fStack_2e4;
  float fStack_2e0;
  float fStack_2dc;
  undefined1 local_2d8 [8];
  float fStack_2d0;
  float fStack_2cc;
  undefined8 local_2c8;
  float fStack_2c0;
  float fStack_2bc;
  float local_2b8;
  float fStack_2b4;
  undefined8 uStack_2b0;
  undefined8 local_2a8;
  float fStack_2a0;
  float fStack_29c;
  float local_298;
  float fStack_294;
  Primitive *local_290;
  RTCFilterFunctionNArguments local_288;
  float local_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  undefined1 local_248 [16];
  float local_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  undefined1 local_228 [16];
  float local_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  uint auStack_208 [4];
  undefined8 local_1f8;
  float local_1f0;
  float local_1ec;
  float fStack_1e8;
  undefined4 local_1e4;
  uint local_1e0;
  uint local_1dc;
  uint local_1d8;
  float local_1c8;
  float fStack_1c4;
  float fStack_1c0;
  float fStack_1bc;
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  undefined1 local_178 [16];
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  float local_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  undefined1 local_b8 [16];
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  float afStack_78 [8];
  float afStack_58 [10];
  ulong uVar110;
  undefined1 auVar122 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar151 [12];
  undefined1 auVar155 [16];
  undefined1 auVar159 [16];
  undefined1 auVar163 [16];
  undefined1 auVar167 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar168 [16];
  int iVar186;
  int iVar187;
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar221 [12];
  undefined1 auVar224 [16];
  undefined1 auVar222 [16];
  undefined1 auVar225 [16];
  undefined1 auVar237 [16];
  undefined1 auVar241 [16];
  undefined1 auVar238 [16];
  undefined1 auVar242 [16];
  undefined1 auVar239 [16];
  undefined1 auVar243 [16];
  undefined1 auVar274 [16];
  undefined1 auVar278 [16];
  undefined1 auVar275 [16];
  undefined1 auVar279 [16];
  undefined1 auVar276 [16];
  undefined1 auVar280 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar373 [16];
  undefined1 auVar374 [16];
  undefined1 auVar386 [16];
  undefined1 auVar387 [16];
  undefined1 auVar406 [16];
  undefined1 auVar407 [16];
  
  PVar15 = prim[1];
  uVar105 = (ulong)(byte)PVar15;
  lVar112 = uVar105 * 0x25;
  uVar109 = *(undefined4 *)(prim + uVar105 * 4 + 6);
  uVar16 = *(undefined4 *)(prim + uVar105 * 5 + 6);
  uVar17 = *(undefined4 *)(prim + uVar105 * 6 + 6);
  uVar18 = *(undefined4 *)(prim + uVar105 * 0xf + 6);
  uVar19 = *(undefined4 *)(prim + (ulong)(byte)PVar15 * 0x10 + 6);
  uVar20 = *(undefined4 *)(prim + uVar105 * 0x11 + 6);
  uVar21 = *(undefined4 *)(prim + uVar105 * 0x1a + 6);
  uVar22 = *(undefined4 *)(prim + uVar105 * 0x1b + 6);
  pPVar8 = prim + lVar112 + 6;
  fVar367 = *(float *)(pPVar8 + 0xc);
  fVar119 = ((ray->org).field_0.m128[0] - *(float *)pPVar8) * fVar367;
  fVar147 = ((ray->org).field_0.m128[1] - *(float *)(pPVar8 + 4)) * fVar367;
  fVar148 = ((ray->org).field_0.m128[2] - *(float *)(pPVar8 + 8)) * fVar367;
  fVar357 = fVar367 * (ray->dir).field_0.m128[0];
  fVar365 = fVar367 * (ray->dir).field_0.m128[1];
  fVar367 = fVar367 * (ray->dir).field_0.m128[2];
  uVar23 = *(undefined4 *)(prim + uVar105 * 0x1c + 6);
  auVar40[0xd] = 0;
  auVar40._0_13_ = in_XMM1._0_13_;
  auVar40[0xe] = in_XMM1[7];
  auVar44[0xc] = in_XMM1[6];
  auVar44._0_12_ = in_XMM1._0_12_;
  auVar44._13_2_ = auVar40._13_2_;
  auVar48[0xb] = 0;
  auVar48._0_11_ = in_XMM1._0_11_;
  auVar48._12_3_ = auVar44._12_3_;
  auVar52[10] = in_XMM1[5];
  auVar52._0_10_ = in_XMM1._0_10_;
  auVar52._11_4_ = auVar48._11_4_;
  auVar56[9] = 0;
  auVar56._0_9_ = in_XMM1._0_9_;
  auVar56._10_5_ = auVar52._10_5_;
  auVar60[8] = in_XMM1[4];
  auVar60._0_8_ = in_XMM1._0_8_;
  auVar60._9_6_ = auVar56._9_6_;
  Var71 = CONCAT81(CONCAT71(auVar60._8_7_,(char)((uint)uVar16 >> 0x18)),in_XMM1[3]);
  auVar72._2_9_ = Var71;
  auVar72[1] = (char)((uint)uVar16 >> 0x10);
  auVar72[0] = in_XMM1[2];
  cVar214 = (char)((uint)uVar16 >> 8);
  auVar73._2_11_ = auVar72;
  auVar73[1] = cVar214;
  auVar73[0] = in_XMM1[1];
  cVar189 = (char)uVar16;
  sVar149 = CONCAT11(cVar189,in_XMM1[0]);
  auVar67._2_13_ = auVar73;
  auVar67._0_2_ = sVar149;
  uVar146 = (undefined2)Var71;
  auVar156._0_12_ = auVar67._0_12_;
  auVar156._12_2_ = uVar146;
  auVar156._14_2_ = uVar146;
  auVar155._12_4_ = auVar156._12_4_;
  auVar155._0_10_ = auVar67._0_10_;
  auVar155._10_2_ = auVar72._0_2_;
  auVar154._10_6_ = auVar155._10_6_;
  auVar154._0_8_ = auVar67._0_8_;
  auVar154._8_2_ = auVar72._0_2_;
  auVar74._4_8_ = auVar154._8_8_;
  auVar74._2_2_ = auVar73._0_2_;
  auVar74._0_2_ = auVar73._0_2_;
  iVar150 = (int)sVar149 >> 8;
  iVar185 = auVar74._0_4_ >> 0x18;
  auVar151._0_8_ = CONCAT44(iVar185,iVar150);
  auVar151._8_4_ = auVar154._8_4_ >> 0x18;
  auVar157._12_4_ = auVar155._12_4_ >> 0x18;
  auVar157._0_12_ = auVar151;
  fVar269 = (float)iVar185;
  cVar188 = cVar214 >> 7;
  auVar41[0xd] = 0;
  auVar41._0_13_ = auVar157._0_13_;
  auVar41[0xe] = cVar188;
  auVar45[0xc] = cVar188;
  auVar45._0_12_ = auVar151;
  auVar45._13_2_ = auVar41._13_2_;
  auVar49[0xb] = 0;
  auVar49._0_11_ = auVar151._0_11_;
  auVar49._12_3_ = auVar45._12_3_;
  auVar53[10] = cVar188;
  auVar53._0_10_ = auVar151._0_10_;
  auVar53._11_4_ = auVar49._11_4_;
  auVar57[9] = 0;
  auVar57._0_9_ = auVar151._0_9_;
  auVar57._10_5_ = auVar53._10_5_;
  auVar61[8] = cVar214;
  auVar61._0_8_ = auVar151._0_8_;
  auVar61._9_6_ = auVar57._9_6_;
  Var71 = CONCAT81(CONCAT71(auVar61._8_7_,(char)((uint)uVar17 >> 0x18)),(short)cVar189 >> 7);
  auVar64._6_9_ = Var71;
  auVar64[5] = (char)((uint)uVar17 >> 0x10);
  auVar64[4] = (undefined1)((short)cVar189 >> 7);
  auVar64._0_4_ = iVar150;
  cVar228 = (char)((uint)uVar17 >> 8);
  auVar75._2_11_ = auVar64._4_11_;
  auVar75[1] = cVar228;
  auVar75[0] = (undefined1)((short)cVar189 >> 7);
  cVar214 = (char)uVar17;
  auVar68._2_13_ = auVar75;
  auVar68._0_2_ = CONCAT11(cVar214,cVar189);
  uVar146 = (undefined2)Var71;
  auVar160._0_12_ = auVar68._0_12_;
  auVar160._12_2_ = uVar146;
  auVar160._14_2_ = uVar146;
  auVar159._12_4_ = auVar160._12_4_;
  auVar159._0_10_ = auVar68._0_10_;
  auVar159._10_2_ = auVar64._4_2_;
  auVar158._10_6_ = auVar159._10_6_;
  auVar158._0_8_ = auVar68._0_8_;
  auVar158._8_2_ = auVar64._4_2_;
  auVar76._4_8_ = auVar158._8_8_;
  auVar76._2_2_ = auVar75._0_2_;
  auVar76._0_2_ = auVar75._0_2_;
  iVar185 = (int)CONCAT11(cVar214,cVar189) >> 8;
  iVar186 = auVar76._0_4_ >> 0x18;
  auVar152._0_8_ = CONCAT44(iVar186,iVar185);
  auVar152._8_4_ = auVar158._8_4_ >> 0x18;
  auVar161._12_4_ = auVar159._12_4_ >> 0x18;
  auVar161._0_12_ = auVar152;
  fVar345 = (float)iVar186;
  cVar188 = cVar228 >> 7;
  auVar42[0xd] = 0;
  auVar42._0_13_ = auVar161._0_13_;
  auVar42[0xe] = cVar188;
  auVar46[0xc] = cVar188;
  auVar46._0_12_ = auVar152;
  auVar46._13_2_ = auVar42._13_2_;
  auVar50[0xb] = 0;
  auVar50._0_11_ = auVar152._0_11_;
  auVar50._12_3_ = auVar46._12_3_;
  auVar54[10] = cVar188;
  auVar54._0_10_ = auVar152._0_10_;
  auVar54._11_4_ = auVar50._11_4_;
  auVar58[9] = 0;
  auVar58._0_9_ = auVar152._0_9_;
  auVar58._10_5_ = auVar54._10_5_;
  auVar62[8] = cVar228;
  auVar62._0_8_ = auVar152._0_8_;
  auVar62._9_6_ = auVar58._9_6_;
  Var71 = CONCAT81(CONCAT71(auVar62._8_7_,(char)((uint)uVar19 >> 0x18)),(short)cVar214 >> 7);
  auVar65._6_9_ = Var71;
  auVar65[5] = (char)((uint)uVar19 >> 0x10);
  auVar65[4] = (undefined1)((short)cVar214 >> 7);
  auVar65._0_4_ = iVar185;
  cVar228 = (char)((uint)uVar19 >> 8);
  auVar77._2_11_ = auVar65._4_11_;
  auVar77[1] = cVar228;
  auVar77[0] = (undefined1)((short)cVar214 >> 7);
  cVar189 = (char)uVar19;
  auVar69._2_13_ = auVar77;
  auVar69._0_2_ = CONCAT11(cVar189,cVar214);
  uVar146 = (undefined2)Var71;
  auVar164._0_12_ = auVar69._0_12_;
  auVar164._12_2_ = uVar146;
  auVar164._14_2_ = uVar146;
  auVar163._12_4_ = auVar164._12_4_;
  auVar163._0_10_ = auVar69._0_10_;
  auVar163._10_2_ = auVar65._4_2_;
  auVar162._10_6_ = auVar163._10_6_;
  auVar162._0_8_ = auVar69._0_8_;
  auVar162._8_2_ = auVar65._4_2_;
  auVar78._4_8_ = auVar162._8_8_;
  auVar78._2_2_ = auVar77._0_2_;
  auVar78._0_2_ = auVar77._0_2_;
  iVar186 = (int)CONCAT11(cVar189,cVar214) >> 8;
  iVar187 = auVar78._0_4_ >> 0x18;
  auVar153._0_8_ = CONCAT44(iVar187,iVar186);
  auVar153._8_4_ = auVar162._8_4_ >> 0x18;
  auVar165._12_4_ = auVar163._12_4_ >> 0x18;
  auVar165._0_12_ = auVar153;
  fVar289 = (float)iVar187;
  cVar188 = cVar228 >> 7;
  auVar43[0xd] = 0;
  auVar43._0_13_ = auVar165._0_13_;
  auVar43[0xe] = cVar188;
  auVar47[0xc] = cVar188;
  auVar47._0_12_ = auVar153;
  auVar47._13_2_ = auVar43._13_2_;
  auVar51[0xb] = 0;
  auVar51._0_11_ = auVar153._0_11_;
  auVar51._12_3_ = auVar47._12_3_;
  auVar55[10] = cVar188;
  auVar55._0_10_ = auVar153._0_10_;
  auVar55._11_4_ = auVar51._11_4_;
  auVar59[9] = 0;
  auVar59._0_9_ = auVar153._0_9_;
  auVar59._10_5_ = auVar55._10_5_;
  auVar63[8] = cVar228;
  auVar63._0_8_ = auVar153._0_8_;
  auVar63._9_6_ = auVar59._9_6_;
  Var71 = CONCAT81(CONCAT71(auVar63._8_7_,(char)((uint)uVar20 >> 0x18)),(short)cVar189 >> 7);
  auVar66._6_9_ = Var71;
  auVar66[5] = (char)((uint)uVar20 >> 0x10);
  auVar66[4] = (undefined1)((short)cVar189 >> 7);
  auVar66._0_4_ = iVar186;
  auVar79._2_11_ = auVar66._4_11_;
  auVar79[1] = (char)((uint)uVar20 >> 8);
  auVar79[0] = (undefined1)((short)cVar189 >> 7);
  sVar149 = CONCAT11((char)uVar20,cVar189);
  auVar70._2_13_ = auVar79;
  auVar70._0_2_ = sVar149;
  uVar146 = (undefined2)Var71;
  auVar168._0_12_ = auVar70._0_12_;
  auVar168._12_2_ = uVar146;
  auVar168._14_2_ = uVar146;
  auVar167._12_4_ = auVar168._12_4_;
  auVar167._0_10_ = auVar70._0_10_;
  auVar167._10_2_ = auVar66._4_2_;
  auVar166._10_6_ = auVar167._10_6_;
  auVar166._0_8_ = auVar70._0_8_;
  auVar166._8_2_ = auVar66._4_2_;
  auVar80._4_8_ = auVar166._8_8_;
  auVar80._2_2_ = auVar79._0_2_;
  auVar80._0_2_ = auVar79._0_2_;
  fVar313 = (float)((int)sVar149 >> 8);
  fVar329 = (float)(auVar80._0_4_ >> 0x18);
  fVar332 = (float)(auVar166._8_4_ >> 0x18);
  fVar219 = fVar367 * fVar313;
  fVar229 = fVar367 * fVar329;
  auVar221._0_8_ = CONCAT44(fVar229,fVar219);
  auVar221._8_4_ = fVar367 * fVar332;
  auVar222._12_4_ = fVar367 * (float)(auVar167._12_4_ >> 0x18);
  auVar222._0_12_ = auVar221;
  fVar190 = ((ray->dir).field_0.m128[3] - *(float *)(prim + lVar112 + 0x16)) *
            *(float *)(prim + lVar112 + 0x1a);
  local_418[0] = (undefined1)uVar109;
  local_418[1] = (undefined1)((uint)uVar109 >> 8);
  local_418[2] = (undefined1)((uint)uVar109 >> 0x10);
  local_418[3] = (undefined1)((uint)uVar109 >> 0x18);
  auVar93[0xd] = 0;
  auVar93._0_13_ = auVar222._0_13_;
  auVar93[0xe] = (char)((uint)fVar229 >> 0x18);
  auVar96[0xc] = (char)((uint)fVar229 >> 0x10);
  auVar96._0_12_ = auVar221;
  auVar96._13_2_ = auVar93._13_2_;
  auVar97[0xb] = 0;
  auVar97._0_11_ = auVar221._0_11_;
  auVar97._12_3_ = auVar96._12_3_;
  auVar98[10] = (char)((uint)fVar229 >> 8);
  auVar98._0_10_ = auVar221._0_10_;
  auVar98._11_4_ = auVar97._11_4_;
  auVar99[9] = 0;
  auVar99._0_9_ = auVar221._0_9_;
  auVar99._10_5_ = auVar98._10_5_;
  auVar100[8] = SUB41(fVar229,0);
  auVar100._0_8_ = auVar221._0_8_;
  auVar100._9_6_ = auVar99._9_6_;
  Var71 = CONCAT81(CONCAT71(auVar100._8_7_,local_418[3]),(char)((uint)fVar219 >> 0x18));
  auVar101._6_9_ = Var71;
  auVar101[5] = local_418[2];
  auVar101[4] = (char)((uint)fVar219 >> 0x10);
  auVar101._0_4_ = fVar219;
  auVar102._2_11_ = auVar101._4_11_;
  auVar102[1] = local_418[1];
  auVar102[0] = (char)((uint)fVar219 >> 8);
  sVar149 = CONCAT11(local_418[0],SUB41(fVar219,0));
  auVar103._2_13_ = auVar102;
  auVar103._0_2_ = sVar149;
  uVar146 = (undefined2)Var71;
  auVar225._0_12_ = auVar103._0_12_;
  auVar225._12_2_ = uVar146;
  auVar225._14_2_ = uVar146;
  auVar224._12_4_ = auVar225._12_4_;
  auVar224._0_10_ = auVar103._0_10_;
  auVar224._10_2_ = auVar101._4_2_;
  auVar223._10_6_ = auVar224._10_6_;
  auVar223._0_8_ = auVar103._0_8_;
  auVar223._8_2_ = auVar101._4_2_;
  auVar81._4_8_ = auVar223._8_8_;
  auVar81._2_2_ = auVar102._0_2_;
  auVar81._0_2_ = auVar102._0_2_;
  fVar220 = (float)((int)sVar149 >> 8);
  fVar230 = (float)(auVar81._0_4_ >> 0x18);
  fVar231 = (float)(auVar223._8_4_ >> 0x18);
  uVar307 = (undefined1)((uint)uVar18 >> 0x18);
  uVar146 = CONCAT11(uVar307,uVar307);
  uVar307 = (undefined1)((uint)uVar18 >> 0x10);
  uVar9 = CONCAT35(CONCAT21(uVar146,uVar307),CONCAT14(uVar307,uVar18));
  uVar307 = (undefined1)((uint)uVar18 >> 8);
  uVar82 = CONCAT51(CONCAT41((int)((ulong)uVar9 >> 0x20),uVar307),uVar307);
  sVar149 = CONCAT11((char)uVar18,(char)uVar18);
  uVar110 = CONCAT62(uVar82,sVar149);
  auVar387._8_4_ = 0;
  auVar387._0_8_ = uVar110;
  auVar387._12_2_ = uVar146;
  auVar387._14_2_ = uVar146;
  uVar146 = (undefined2)((ulong)uVar9 >> 0x20);
  auVar386._12_4_ = auVar387._12_4_;
  auVar386._8_2_ = 0;
  auVar386._0_8_ = uVar110;
  auVar386._10_2_ = uVar146;
  auVar385._10_6_ = auVar386._10_6_;
  auVar385._8_2_ = uVar146;
  auVar385._0_8_ = uVar110;
  uVar146 = (undefined2)uVar82;
  auVar83._4_8_ = auVar385._8_8_;
  auVar83._2_2_ = uVar146;
  auVar83._0_2_ = uVar146;
  fVar384 = (float)((int)sVar149 >> 8);
  fVar392 = (float)(auVar83._0_4_ >> 0x18);
  fVar393 = (float)(auVar385._8_4_ >> 0x18);
  uVar307 = (undefined1)((uint)uVar21 >> 0x18);
  uVar146 = CONCAT11(uVar307,uVar307);
  uVar307 = (undefined1)((uint)uVar21 >> 0x10);
  uVar9 = CONCAT35(CONCAT21(uVar146,uVar307),CONCAT14(uVar307,uVar21));
  uVar307 = (undefined1)((uint)uVar21 >> 8);
  uVar82 = CONCAT51(CONCAT41((int)((ulong)uVar9 >> 0x20),uVar307),uVar307);
  sVar149 = CONCAT11((char)uVar21,(char)uVar21);
  uVar110 = CONCAT62(uVar82,sVar149);
  auVar298._8_4_ = 0;
  auVar298._0_8_ = uVar110;
  auVar298._12_2_ = uVar146;
  auVar298._14_2_ = uVar146;
  uVar146 = (undefined2)((ulong)uVar9 >> 0x20);
  auVar297._12_4_ = auVar298._12_4_;
  auVar297._8_2_ = 0;
  auVar297._0_8_ = uVar110;
  auVar297._10_2_ = uVar146;
  auVar296._10_6_ = auVar297._10_6_;
  auVar296._8_2_ = uVar146;
  auVar296._0_8_ = uVar110;
  uVar146 = (undefined2)uVar82;
  auVar84._4_8_ = auVar296._8_8_;
  auVar84._2_2_ = uVar146;
  auVar84._0_2_ = uVar146;
  fVar294 = (float)((int)sVar149 >> 8);
  fVar308 = (float)(auVar84._0_4_ >> 0x18);
  fVar310 = (float)(auVar296._8_4_ >> 0x18);
  uVar307 = (undefined1)((uint)uVar22 >> 0x18);
  uVar146 = CONCAT11(uVar307,uVar307);
  uVar307 = (undefined1)((uint)uVar22 >> 0x10);
  uVar9 = CONCAT35(CONCAT21(uVar146,uVar307),CONCAT14(uVar307,uVar22));
  uVar307 = (undefined1)((uint)uVar22 >> 8);
  uVar82 = CONCAT51(CONCAT41((int)((ulong)uVar9 >> 0x20),uVar307),uVar307);
  sVar149 = CONCAT11((char)uVar22,(char)uVar22);
  uVar110 = CONCAT62(uVar82,sVar149);
  auVar374._8_4_ = 0;
  auVar374._0_8_ = uVar110;
  auVar374._12_2_ = uVar146;
  auVar374._14_2_ = uVar146;
  uVar146 = (undefined2)((ulong)uVar9 >> 0x20);
  auVar373._12_4_ = auVar374._12_4_;
  auVar373._8_2_ = 0;
  auVar373._0_8_ = uVar110;
  auVar373._10_2_ = uVar146;
  auVar372._10_6_ = auVar373._10_6_;
  auVar372._8_2_ = uVar146;
  auVar372._0_8_ = uVar110;
  uVar146 = (undefined2)uVar82;
  auVar85._4_8_ = auVar372._8_8_;
  auVar85._2_2_ = uVar146;
  auVar85._0_2_ = uVar146;
  fVar370 = (float)((int)sVar149 >> 8);
  fVar379 = (float)(auVar85._0_4_ >> 0x18);
  fVar381 = (float)(auVar372._8_4_ >> 0x18);
  uVar307 = (undefined1)((uint)uVar23 >> 0x18);
  uVar146 = CONCAT11(uVar307,uVar307);
  uVar307 = (undefined1)((uint)uVar23 >> 0x10);
  uVar9 = CONCAT35(CONCAT21(uVar146,uVar307),CONCAT14(uVar307,uVar23));
  uVar307 = (undefined1)((uint)uVar23 >> 8);
  uVar82 = CONCAT51(CONCAT41((int)((ulong)uVar9 >> 0x20),uVar307),uVar307);
  sVar149 = CONCAT11((char)uVar23,(char)uVar23);
  uVar110 = CONCAT62(uVar82,sVar149);
  auVar407._8_4_ = 0;
  auVar407._0_8_ = uVar110;
  auVar407._12_2_ = uVar146;
  auVar407._14_2_ = uVar146;
  uVar146 = (undefined2)((ulong)uVar9 >> 0x20);
  auVar406._12_4_ = auVar407._12_4_;
  auVar406._8_2_ = 0;
  auVar406._0_8_ = uVar110;
  auVar406._10_2_ = uVar146;
  auVar405._10_6_ = auVar406._10_6_;
  auVar405._8_2_ = uVar146;
  auVar405._0_8_ = uVar110;
  uVar146 = (undefined2)uVar82;
  auVar86._4_8_ = auVar405._8_8_;
  auVar86._2_2_ = uVar146;
  auVar86._0_2_ = uVar146;
  fVar191 = (float)((int)sVar149 >> 8);
  fVar216 = (float)(auVar86._0_4_ >> 0x18);
  fVar218 = (float)(auVar405._8_4_ >> 0x18);
  fVar404 = fVar357 * fVar220 + fVar365 * (float)iVar150 + fVar367 * (float)iVar185;
  fVar410 = fVar357 * fVar230 + fVar365 * fVar269 + fVar367 * fVar345;
  fVar411 = fVar357 * fVar231 + fVar365 * (float)auVar151._8_4_ + fVar367 * (float)auVar152._8_4_;
  fVar412 = fVar357 * (float)(auVar224._12_4_ >> 0x18) +
            fVar365 * (float)auVar157._12_4_ + fVar367 * (float)auVar161._12_4_;
  fVar395 = fVar357 * fVar384 + fVar365 * (float)iVar186 + fVar219;
  fVar401 = fVar357 * fVar392 + fVar365 * fVar289 + fVar229;
  fVar402 = fVar357 * fVar393 + fVar365 * (float)auVar153._8_4_ + auVar221._8_4_;
  fVar403 = fVar357 * (float)(auVar386._12_4_ >> 0x18) +
            fVar365 * (float)auVar165._12_4_ + auVar222._12_4_;
  fVar255 = fVar357 * fVar294 + fVar365 * fVar370 + fVar367 * fVar191;
  fVar266 = fVar357 * fVar308 + fVar365 * fVar379 + fVar367 * fVar216;
  fVar267 = fVar357 * fVar310 + fVar365 * fVar381 + fVar367 * fVar218;
  fVar357 = fVar357 * (float)(auVar297._12_4_ >> 0x18) +
            fVar365 * (float)(auVar373._12_4_ >> 0x18) + fVar367 * (float)(auVar406._12_4_ >> 0x18);
  uVar9 = *(undefined8 *)(prim + uVar105 * 7 + 6);
  uVar10 = *(undefined8 *)(prim + uVar105 * 0xb + 6);
  uVar11 = *(undefined8 *)(prim + uVar105 * 9 + 6);
  uVar12 = *(undefined8 *)(prim + uVar105 * 0xd + 6);
  uVar110 = *(ulong *)(prim + uVar105 * 0x12 + 6);
  fVar365 = fVar220 * fVar119 + (float)iVar150 * fVar147 + (float)iVar185 * fVar148;
  fVar345 = fVar230 * fVar119 + fVar269 * fVar147 + fVar345 * fVar148;
  fVar232 = fVar231 * fVar119 + (float)auVar151._8_4_ * fVar147 + (float)auVar152._8_4_ * fVar148;
  fVar233 = (float)(auVar224._12_4_ >> 0x18) * fVar119 +
            (float)auVar157._12_4_ * fVar147 + (float)auVar161._12_4_ * fVar148;
  fVar384 = fVar384 * fVar119 + (float)iVar186 * fVar147 + fVar313 * fVar148;
  fVar392 = fVar392 * fVar119 + fVar289 * fVar147 + fVar329 * fVar148;
  fVar393 = fVar393 * fVar119 + (float)auVar153._8_4_ * fVar147 + fVar332 * fVar148;
  fVar394 = (float)(auVar386._12_4_ >> 0x18) * fVar119 +
            (float)auVar165._12_4_ * fVar147 + (float)(auVar167._12_4_ >> 0x18) * fVar148;
  fVar219 = fVar119 * fVar294 + fVar147 * fVar370 + fVar148 * fVar191;
  fVar220 = fVar119 * fVar308 + fVar147 * fVar379 + fVar148 * fVar216;
  fVar229 = fVar119 * fVar310 + fVar147 * fVar381 + fVar148 * fVar218;
  fVar230 = fVar119 * (float)(auVar297._12_4_ >> 0x18) +
            fVar147 * (float)(auVar373._12_4_ >> 0x18) + fVar148 * (float)(auVar406._12_4_ >> 0x18);
  fVar367 = (float)DAT_01f4bd50;
  fVar119 = DAT_01f4bd50._4_4_;
  fVar147 = DAT_01f4bd50._8_4_;
  fVar148 = DAT_01f4bd50._12_4_;
  uVar115 = -(uint)(fVar367 <= ABS(fVar404));
  uVar116 = -(uint)(fVar119 <= ABS(fVar410));
  uVar117 = -(uint)(fVar147 <= ABS(fVar411));
  uVar118 = -(uint)(fVar148 <= ABS(fVar412));
  auVar408._0_4_ = (uint)fVar404 & uVar115;
  auVar408._4_4_ = (uint)fVar410 & uVar116;
  auVar408._8_4_ = (uint)fVar411 & uVar117;
  auVar408._12_4_ = (uint)fVar412 & uVar118;
  auVar192._0_4_ = ~uVar115 & (uint)fVar367;
  auVar192._4_4_ = ~uVar116 & (uint)fVar119;
  auVar192._8_4_ = ~uVar117 & (uint)fVar147;
  auVar192._12_4_ = ~uVar118 & (uint)fVar148;
  auVar192 = auVar192 | auVar408;
  uVar115 = -(uint)(fVar367 <= ABS(fVar395));
  uVar116 = -(uint)(fVar119 <= ABS(fVar401));
  uVar117 = -(uint)(fVar147 <= ABS(fVar402));
  uVar118 = -(uint)(fVar148 <= ABS(fVar403));
  auVar396._0_4_ = (uint)fVar395 & uVar115;
  auVar396._4_4_ = (uint)fVar401 & uVar116;
  auVar396._8_4_ = (uint)fVar402 & uVar117;
  auVar396._12_4_ = (uint)fVar403 & uVar118;
  auVar272._0_4_ = ~uVar115 & (uint)fVar367;
  auVar272._4_4_ = ~uVar116 & (uint)fVar119;
  auVar272._8_4_ = ~uVar117 & (uint)fVar147;
  auVar272._12_4_ = ~uVar118 & (uint)fVar148;
  auVar272 = auVar272 | auVar396;
  uVar115 = -(uint)(fVar367 <= ABS(fVar255));
  uVar116 = -(uint)(fVar119 <= ABS(fVar266));
  uVar117 = -(uint)(fVar147 <= ABS(fVar267));
  uVar118 = -(uint)(fVar148 <= ABS(fVar357));
  auVar256._0_4_ = (uint)fVar255 & uVar115;
  auVar256._4_4_ = (uint)fVar266 & uVar116;
  auVar256._8_4_ = (uint)fVar267 & uVar117;
  auVar256._12_4_ = (uint)fVar357 & uVar118;
  auVar397._0_4_ = ~uVar115 & (uint)fVar367;
  auVar397._4_4_ = ~uVar116 & (uint)fVar119;
  auVar397._8_4_ = ~uVar117 & (uint)fVar147;
  auVar397._12_4_ = ~uVar118 & (uint)fVar148;
  auVar397 = auVar397 | auVar256;
  auVar235 = rcpps(_DAT_01f4bd50,auVar192);
  auVar236._0_4_ = auVar235._0_4_;
  auVar193._0_4_ = auVar192._0_4_ * auVar236._0_4_;
  fVar308 = auVar235._4_4_;
  auVar193._4_4_ = auVar192._4_4_ * fVar308;
  fVar310 = auVar235._8_4_;
  auVar193._8_4_ = auVar192._8_4_ * fVar310;
  fVar313 = auVar235._12_4_;
  auVar193._12_4_ = auVar192._12_4_ * fVar313;
  fVar332 = (1.0 - auVar193._0_4_) * auVar236._0_4_ + auVar236._0_4_;
  fVar308 = (1.0 - auVar193._4_4_) * fVar308 + fVar308;
  fVar310 = (1.0 - auVar193._8_4_) * fVar310 + fVar310;
  fVar313 = (1.0 - auVar193._12_4_) * fVar313 + fVar313;
  auVar194 = rcpps(auVar193,auVar272);
  fVar231 = auVar194._0_4_;
  fVar266 = auVar194._4_4_;
  fVar357 = auVar194._8_4_;
  fVar289 = auVar194._12_4_;
  fVar231 = (1.0 - auVar272._0_4_ * fVar231) * fVar231 + fVar231;
  fVar266 = (1.0 - auVar272._4_4_ * fVar266) * fVar266 + fVar266;
  fVar357 = (1.0 - auVar272._8_4_ * fVar357) * fVar357 + fVar357;
  fVar289 = (1.0 - auVar272._12_4_ * fVar289) * fVar289 + fVar289;
  auVar194 = rcpps(auVar194,auVar397);
  fVar255 = auVar194._0_4_;
  fVar267 = auVar194._4_4_;
  fVar269 = auVar194._8_4_;
  fVar294 = auVar194._12_4_;
  uVar13 = *(undefined8 *)(prim + uVar105 * 0x16 + 6);
  fVar255 = (1.0 - auVar397._0_4_ * fVar255) * fVar255 + fVar255;
  fVar267 = (1.0 - auVar397._4_4_ * fVar267) * fVar267 + fVar267;
  fVar269 = (1.0 - auVar397._8_4_ * fVar269) * fVar269 + fVar269;
  fVar294 = (1.0 - auVar397._12_4_ * fVar294) * fVar294 + fVar294;
  uVar106 = *(ulong *)(prim + uVar105 * 0x14 + 6);
  auVar239._0_12_ = auVar235._0_12_;
  auVar239._12_2_ = auVar235._6_2_;
  auVar239._14_2_ = (short)((ulong)uVar9 >> 0x30);
  auVar238._12_4_ = auVar239._12_4_;
  auVar238._0_10_ = auVar235._0_10_;
  auVar238._10_2_ = (short)((ulong)uVar9 >> 0x20);
  auVar237._10_6_ = auVar238._10_6_;
  auVar237._0_8_ = auVar235._0_8_;
  auVar237._8_2_ = auVar235._4_2_;
  auVar236._8_8_ = auVar237._8_8_;
  sVar149 = (short)((ulong)uVar9 >> 0x10);
  auVar236._6_2_ = sVar149;
  auVar236._4_2_ = auVar235._2_2_;
  auVar240._0_4_ = (int)(short)uVar9;
  iVar150 = auVar236._4_4_ >> 0x10;
  auVar234._0_8_ = CONCAT44(iVar150,auVar240._0_4_);
  auVar234._8_4_ = auVar237._8_4_ >> 0x10;
  auVar273._0_4_ = (float)auVar240._0_4_;
  fVar329 = (float)iVar150;
  auVar270._0_8_ = CONCAT44(fVar329,auVar273._0_4_);
  auVar270._8_4_ = (float)auVar234._8_4_;
  auVar243._12_2_ = sVar149 >> 0xf;
  auVar243._0_12_ = auVar234;
  auVar243._14_2_ = (short)((ulong)uVar10 >> 0x30);
  auVar242._12_4_ = auVar243._12_4_;
  auVar242._0_10_ = auVar234._0_10_;
  auVar242._10_2_ = (short)((ulong)uVar10 >> 0x20);
  auVar241._10_6_ = auVar242._10_6_;
  auVar241._8_2_ = sVar149;
  auVar241._0_8_ = auVar234._0_8_;
  auVar240._8_8_ = auVar241._8_8_;
  auVar240._6_2_ = (short)((ulong)uVar10 >> 0x10);
  auVar240._4_2_ = (short)uVar9 >> 0xf;
  uVar9 = *(undefined8 *)(prim + uVar105 * 0x18 + 6);
  auVar276._12_2_ = (short)((uint)fVar329 >> 0x10);
  auVar276._0_12_ = auVar270;
  auVar276._14_2_ = (short)((ulong)uVar11 >> 0x30);
  auVar275._12_4_ = auVar276._12_4_;
  auVar275._0_10_ = auVar270._0_10_;
  auVar275._10_2_ = (short)((ulong)uVar11 >> 0x20);
  auVar274._10_6_ = auVar275._10_6_;
  auVar274._8_2_ = SUB42(fVar329,0);
  auVar274._0_8_ = auVar270._0_8_;
  auVar273._8_8_ = auVar274._8_8_;
  sVar149 = (short)((ulong)uVar11 >> 0x10);
  auVar273._6_2_ = sVar149;
  auVar273._4_2_ = (short)((uint)auVar273._0_4_ >> 0x10);
  auVar277._0_4_ = (int)(short)uVar11;
  iVar150 = auVar273._4_4_ >> 0x10;
  auVar271._0_8_ = CONCAT44(iVar150,auVar277._0_4_);
  auVar271._8_4_ = auVar274._8_4_ >> 0x10;
  auVar317._0_4_ = (float)auVar277._0_4_;
  fVar370 = (float)iVar150;
  auVar316._0_8_ = CONCAT44(fVar370,auVar317._0_4_);
  auVar316._8_4_ = (float)auVar271._8_4_;
  auVar280._12_2_ = sVar149 >> 0xf;
  auVar280._0_12_ = auVar271;
  auVar280._14_2_ = (short)((ulong)uVar12 >> 0x30);
  auVar279._12_4_ = auVar280._12_4_;
  auVar279._0_10_ = auVar271._0_10_;
  auVar279._10_2_ = (short)((ulong)uVar12 >> 0x20);
  auVar278._10_6_ = auVar279._10_6_;
  auVar278._8_2_ = sVar149;
  auVar278._0_8_ = auVar271._0_8_;
  auVar277._8_8_ = auVar278._8_8_;
  auVar277._6_2_ = (short)((ulong)uVar12 >> 0x10);
  auVar277._4_2_ = (short)uVar11 >> 0xf;
  uVar146 = (undefined2)(uVar110 >> 0x30);
  auVar173._8_4_ = 0;
  auVar173._0_8_ = uVar110;
  auVar173._12_2_ = uVar146;
  auVar173._14_2_ = uVar146;
  uVar146 = (undefined2)(uVar110 >> 0x20);
  auVar235._12_4_ = auVar173._12_4_;
  auVar235._8_2_ = 0;
  auVar235._0_8_ = uVar110;
  auVar235._10_2_ = uVar146;
  auVar194._10_6_ = auVar235._10_6_;
  auVar194._8_2_ = uVar146;
  auVar194._0_8_ = uVar110;
  uVar146 = (undefined2)(uVar110 >> 0x10);
  auVar87._4_8_ = auVar194._8_8_;
  auVar87._2_2_ = uVar146;
  auVar87._0_2_ = uVar146;
  auVar121._0_4_ = (float)(int)(short)uVar110;
  fVar367 = (float)(auVar87._0_4_ >> 0x10);
  auVar120._0_8_ = CONCAT44(fVar367,auVar121._0_4_);
  auVar120._8_4_ = (float)(auVar194._8_4_ >> 0x10);
  auVar320._12_2_ = (short)((uint)fVar370 >> 0x10);
  auVar320._0_12_ = auVar316;
  auVar320._14_2_ = (short)((ulong)uVar13 >> 0x30);
  auVar319._12_4_ = auVar320._12_4_;
  auVar319._0_10_ = auVar316._0_10_;
  auVar319._10_2_ = (short)((ulong)uVar13 >> 0x20);
  auVar318._10_6_ = auVar319._10_6_;
  auVar318._8_2_ = SUB42(fVar370,0);
  auVar318._0_8_ = auVar316._0_8_;
  auVar317._8_8_ = auVar318._8_8_;
  auVar317._6_2_ = (short)((ulong)uVar13 >> 0x10);
  auVar317._4_2_ = (short)((uint)auVar317._0_4_ >> 0x10);
  uVar217 = (undefined2)(uVar106 >> 0x30);
  auVar206._12_2_ = (short)((uint)fVar367 >> 0x10);
  auVar206._0_12_ = auVar120;
  auVar206._14_2_ = uVar217;
  auVar323._12_4_ = auVar206._12_4_;
  auVar323._0_10_ = auVar120._0_10_;
  uVar215 = (undefined2)(uVar106 >> 0x20);
  auVar323._10_2_ = uVar215;
  auVar122._10_6_ = auVar323._10_6_;
  auVar122._8_2_ = SUB42(fVar367,0);
  auVar122._0_8_ = auVar120._0_8_;
  auVar121._8_8_ = auVar122._8_8_;
  uVar146 = (undefined2)(uVar106 >> 0x10);
  auVar121._6_2_ = uVar146;
  auVar121._4_2_ = (short)((uint)auVar121._0_4_ >> 0x10);
  fVar119 = (float)(auVar121._4_4_ >> 0x10);
  fVar191 = (float)(auVar122._8_4_ >> 0x10);
  auVar197._8_4_ = 0;
  auVar197._0_8_ = uVar106;
  auVar197._12_2_ = uVar217;
  auVar197._14_2_ = (short)((ulong)uVar9 >> 0x30);
  auVar196._12_4_ = auVar197._12_4_;
  auVar196._8_2_ = 0;
  auVar196._0_8_ = uVar106;
  auVar196._10_2_ = (short)((ulong)uVar9 >> 0x20);
  auVar195._10_6_ = auVar196._10_6_;
  auVar195._8_2_ = uVar215;
  auVar195._0_8_ = uVar106;
  auVar88._4_8_ = auVar195._8_8_;
  auVar88._2_2_ = (short)((ulong)uVar9 >> 0x10);
  auVar88._0_2_ = uVar146;
  uVar110 = *(ulong *)(prim + uVar105 * 0x1d + 6);
  uVar146 = (undefined2)(uVar110 >> 0x30);
  auVar125._8_4_ = 0;
  auVar125._0_8_ = uVar110;
  auVar125._12_2_ = uVar146;
  auVar125._14_2_ = uVar146;
  uVar146 = (undefined2)(uVar110 >> 0x20);
  auVar124._12_4_ = auVar125._12_4_;
  auVar124._8_2_ = 0;
  auVar124._0_8_ = uVar110;
  auVar124._10_2_ = uVar146;
  auVar123._10_6_ = auVar124._10_6_;
  auVar123._8_2_ = uVar146;
  auVar123._0_8_ = uVar110;
  uVar146 = (undefined2)(uVar110 >> 0x10);
  auVar89._4_8_ = auVar123._8_8_;
  auVar89._2_2_ = uVar146;
  auVar89._0_2_ = uVar146;
  fVar147 = (float)(auVar89._0_4_ >> 0x10);
  fVar216 = (float)(auVar123._8_4_ >> 0x10);
  uVar108 = *(ulong *)(prim + uVar105 * 0x21 + 6);
  uVar146 = (undefined2)(uVar108 >> 0x30);
  auVar200._8_4_ = 0;
  auVar200._0_8_ = uVar108;
  auVar200._12_2_ = uVar146;
  auVar200._14_2_ = uVar146;
  uVar146 = (undefined2)(uVar108 >> 0x20);
  auVar199._12_4_ = auVar200._12_4_;
  auVar199._8_2_ = 0;
  auVar199._0_8_ = uVar108;
  auVar199._10_2_ = uVar146;
  auVar198._10_6_ = auVar199._10_6_;
  auVar198._8_2_ = uVar146;
  auVar198._0_8_ = uVar108;
  uVar146 = (undefined2)(uVar108 >> 0x10);
  auVar90._4_8_ = auVar198._8_8_;
  auVar90._2_2_ = uVar146;
  auVar90._0_2_ = uVar146;
  uVar14 = *(ulong *)(prim + uVar105 * 0x1f + 6);
  uVar146 = (undefined2)(uVar14 >> 0x30);
  auVar128._8_4_ = 0;
  auVar128._0_8_ = uVar14;
  auVar128._12_2_ = uVar146;
  auVar128._14_2_ = uVar146;
  uVar146 = (undefined2)(uVar14 >> 0x20);
  auVar127._12_4_ = auVar128._12_4_;
  auVar127._8_2_ = 0;
  auVar127._0_8_ = uVar14;
  auVar127._10_2_ = uVar146;
  auVar126._10_6_ = auVar127._10_6_;
  auVar126._8_2_ = uVar146;
  auVar126._0_8_ = uVar14;
  uVar146 = (undefined2)(uVar14 >> 0x10);
  auVar91._4_8_ = auVar126._8_8_;
  auVar91._2_2_ = uVar146;
  auVar91._0_2_ = uVar146;
  fVar148 = (float)(auVar91._0_4_ >> 0x10);
  fVar218 = (float)(auVar126._8_4_ >> 0x10);
  uVar105 = *(ulong *)(prim + uVar105 * 0x23 + 6);
  uVar146 = (undefined2)(uVar105 >> 0x30);
  auVar203._8_4_ = 0;
  auVar203._0_8_ = uVar105;
  auVar203._12_2_ = uVar146;
  auVar203._14_2_ = uVar146;
  uVar146 = (undefined2)(uVar105 >> 0x20);
  auVar202._12_4_ = auVar203._12_4_;
  auVar202._8_2_ = 0;
  auVar202._0_8_ = uVar105;
  auVar202._10_2_ = uVar146;
  auVar201._10_6_ = auVar202._10_6_;
  auVar201._8_2_ = uVar146;
  auVar201._0_8_ = uVar105;
  uVar146 = (undefined2)(uVar105 >> 0x10);
  auVar92._4_8_ = auVar201._8_8_;
  auVar92._2_2_ = uVar146;
  auVar92._0_2_ = uVar146;
  auVar244._0_8_ =
       CONCAT44(((((float)(auVar240._4_4_ >> 0x10) - fVar329) * fVar190 + fVar329) - fVar345) *
                fVar308,((((float)(int)(short)uVar10 - auVar273._0_4_) * fVar190 + auVar273._0_4_) -
                        fVar365) * fVar332);
  auVar244._8_4_ =
       ((((float)(auVar241._8_4_ >> 0x10) - auVar270._8_4_) * fVar190 + auVar270._8_4_) - fVar232) *
       fVar310;
  auVar244._12_4_ =
       ((((float)(auVar242._12_4_ >> 0x10) - (float)(auVar238._12_4_ >> 0x10)) * fVar190 +
        (float)(auVar238._12_4_ >> 0x10)) - fVar233) * fVar313;
  auVar281._0_4_ =
       ((((float)(int)(short)uVar12 - auVar317._0_4_) * fVar190 + auVar317._0_4_) - fVar365) *
       fVar332;
  auVar281._4_4_ =
       ((((float)(auVar277._4_4_ >> 0x10) - fVar370) * fVar190 + fVar370) - fVar345) * fVar308;
  auVar281._8_4_ =
       ((((float)(auVar278._8_4_ >> 0x10) - auVar316._8_4_) * fVar190 + auVar316._8_4_) - fVar232) *
       fVar310;
  auVar281._12_4_ =
       ((((float)(auVar279._12_4_ >> 0x10) - (float)(auVar275._12_4_ >> 0x10)) * fVar190 +
        (float)(auVar275._12_4_ >> 0x10)) - fVar233) * fVar313;
  auVar321._0_8_ =
       CONCAT44(((((float)(auVar317._4_4_ >> 0x10) - fVar367) * fVar190 + fVar367) - fVar392) *
                fVar266,((((float)(int)(short)uVar13 - auVar121._0_4_) * fVar190 + auVar121._0_4_) -
                        fVar384) * fVar231);
  auVar321._8_4_ =
       ((((float)(auVar318._8_4_ >> 0x10) - auVar120._8_4_) * fVar190 + auVar120._8_4_) - fVar393) *
       fVar357;
  auVar321._12_4_ =
       ((((float)(auVar319._12_4_ >> 0x10) - (float)(auVar235._12_4_ >> 0x10)) * fVar190 +
        (float)(auVar235._12_4_ >> 0x10)) - fVar394) * fVar289;
  auVar339._0_4_ =
       ((((float)(int)(short)uVar9 - (float)(int)(short)uVar106) * fVar190 +
        (float)(int)(short)uVar106) - fVar384) * fVar231;
  auVar339._4_4_ =
       ((((float)(auVar88._0_4_ >> 0x10) - fVar119) * fVar190 + fVar119) - fVar392) * fVar266;
  auVar339._8_4_ =
       ((((float)(auVar195._8_4_ >> 0x10) - fVar191) * fVar190 + fVar191) - fVar393) * fVar357;
  auVar339._12_4_ =
       ((((float)(auVar196._12_4_ >> 0x10) - (float)(auVar323._12_4_ >> 0x10)) * fVar190 +
        (float)(auVar323._12_4_ >> 0x10)) - fVar394) * fVar289;
  auVar359._0_8_ =
       CONCAT44(((((float)(auVar90._0_4_ >> 0x10) - fVar147) * fVar190 + fVar147) - fVar220) *
                fVar267,((((float)(int)(short)uVar108 - (float)(int)(short)uVar110) * fVar190 +
                         (float)(int)(short)uVar110) - fVar219) * fVar255);
  auVar359._8_4_ =
       ((((float)(auVar198._8_4_ >> 0x10) - fVar216) * fVar190 + fVar216) - fVar229) * fVar269;
  auVar359._12_4_ =
       ((((float)(auVar199._12_4_ >> 0x10) - (float)(auVar124._12_4_ >> 0x10)) * fVar190 +
        (float)(auVar124._12_4_ >> 0x10)) - fVar230) * fVar294;
  auVar375._0_4_ =
       ((((float)(int)(short)uVar105 - (float)(int)(short)uVar14) * fVar190 +
        (float)(int)(short)uVar14) - fVar219) * fVar255;
  auVar375._4_4_ =
       ((((float)(auVar92._0_4_ >> 0x10) - fVar148) * fVar190 + fVar148) - fVar220) * fVar267;
  auVar375._8_4_ =
       ((((float)(auVar201._8_4_ >> 0x10) - fVar218) * fVar190 + fVar218) - fVar229) * fVar269;
  auVar375._12_4_ =
       ((((float)(auVar202._12_4_ >> 0x10) - (float)(auVar127._12_4_ >> 0x10)) * fVar190 +
        (float)(auVar127._12_4_ >> 0x10)) - fVar230) * fVar294;
  auVar204._8_4_ = auVar244._8_4_;
  auVar204._0_8_ = auVar244._0_8_;
  auVar204._12_4_ = auVar244._12_4_;
  auVar235 = minps(auVar204,auVar281);
  auVar129._8_4_ = auVar321._8_4_;
  auVar129._0_8_ = auVar321._0_8_;
  auVar129._12_4_ = auVar321._12_4_;
  auVar194 = minps(auVar129,auVar339);
  auVar235 = maxps(auVar235,auVar194);
  auVar130._8_4_ = auVar359._8_4_;
  auVar130._0_8_ = auVar359._0_8_;
  auVar130._12_4_ = auVar359._12_4_;
  auVar194 = minps(auVar130,auVar375);
  uVar109 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar169._4_4_ = uVar109;
  auVar169._0_4_ = uVar109;
  auVar169._8_4_ = uVar109;
  auVar169._12_4_ = uVar109;
  auVar194 = maxps(auVar194,auVar169);
  auVar194 = maxps(auVar235,auVar194);
  local_188 = auVar194._0_4_ * 0.99999964;
  fStack_184 = auVar194._4_4_ * 0.99999964;
  fStack_180 = auVar194._8_4_ * 0.99999964;
  fStack_17c = auVar194._12_4_ * 0.99999964;
  auVar194 = maxps(auVar244,auVar281);
  auVar235 = maxps(auVar321,auVar339);
  auVar194 = minps(auVar194,auVar235);
  auVar235 = maxps(auVar359,auVar375);
  fVar367 = ray->tfar;
  auVar131._4_4_ = fVar367;
  auVar131._0_4_ = fVar367;
  auVar131._8_4_ = fVar367;
  auVar131._12_4_ = fVar367;
  auVar235 = minps(auVar235,auVar131);
  auVar194 = minps(auVar194,auVar235);
  auVar170._0_4_ = -(uint)(PVar15 != (Primitive)0x0 && local_188 <= auVar194._0_4_ * 1.0000004);
  auVar170._4_4_ = -(uint)(1 < (byte)PVar15 && fStack_184 <= auVar194._4_4_ * 1.0000004);
  auVar170._8_4_ = -(uint)(2 < (byte)PVar15 && fStack_180 <= auVar194._8_4_ * 1.0000004);
  auVar170._12_4_ = -(uint)(3 < (byte)PVar15 && fStack_17c <= auVar194._12_4_ * 1.0000004);
  uVar109 = movmskps((int)unaff_RBP,auVar170);
  uVar110 = CONCAT44((int)((ulong)unaff_RBP >> 0x20),uVar109);
  local_178._0_4_ = -(uint)((int)mm_lookupmask_ps._240_4_ < 0);
  local_178._4_4_ = -(uint)((int)mm_lookupmask_ps._244_4_ < 0);
  local_178._8_4_ = -(uint)((int)mm_lookupmask_ps._248_4_ < 0);
  local_178._12_4_ = 0;
  local_290 = prim;
LAB_0036d436:
  if (uVar110 == 0) {
LAB_0036f82b:
    return uVar110 != 0;
  }
  lVar112 = 0;
  if (uVar110 != 0) {
    for (; (uVar110 >> lVar112 & 1) == 0; lVar112 = lVar112 + 1) {
    }
  }
  uVar115 = *(uint *)(local_290 + 2);
  uVar116 = *(uint *)(local_290 + lVar112 * 4 + 6);
  pGVar24 = (context->scene->geometries).items[uVar115].ptr;
  fVar367 = pGVar24->fnumTimeSegments;
  fVar119 = (pGVar24->time_range).lower;
  fVar147 = (((ray->dir).field_0.m128[3] - fVar119) / ((pGVar24->time_range).upper - fVar119)) *
            fVar367;
  fVar119 = floorf(fVar147);
  fVar367 = fVar367 + -1.0;
  if (fVar367 <= fVar119) {
    fVar119 = fVar367;
  }
  fVar367 = 0.0;
  if (0.0 <= fVar119) {
    fVar367 = fVar119;
  }
  fVar147 = fVar147 - fVar367;
  uVar106 = (ulong)*(uint *)(*(long *)&pGVar24->field_0x58 +
                            (ulong)uVar116 *
                            pGVar24[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                            _M_i);
  _Var25 = pGVar24[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar111 = (long)(int)fVar367 * 0x38;
  lVar26 = *(long *)(_Var25 + lVar111);
  lVar27 = *(long *)(_Var25 + 0x10 + lVar111);
  pfVar3 = (float *)(lVar26 + lVar27 * uVar106);
  fVar367 = *pfVar3;
  fVar119 = pfVar3[1];
  fVar148 = pfVar3[2];
  fVar191 = pfVar3[3];
  lVar112 = uVar106 + 1;
  pfVar3 = (float *)(lVar26 + lVar27 * lVar112);
  lVar1 = uVar106 + 2;
  pfVar4 = (float *)(lVar26 + lVar27 * lVar1);
  lVar2 = uVar106 + 3;
  pfVar5 = (float *)(lVar26 + lVar27 * lVar2);
  fVar216 = *pfVar5;
  fVar218 = pfVar5[1];
  fVar219 = pfVar5[2];
  fVar220 = pfVar5[3];
  lVar26 = *(long *)&pGVar24[4].fnumTimeSegments;
  lVar27 = *(long *)(lVar26 + lVar111);
  lVar28 = *(long *)(lVar26 + 0x10 + lVar111);
  pfVar5 = (float *)(lVar27 + lVar28 * uVar106);
  fVar229 = *pfVar5;
  fVar230 = pfVar5[1];
  fVar190 = pfVar5[2];
  fVar231 = pfVar5[3];
  pfVar5 = (float *)(lVar27 + lVar28 * lVar112);
  pfVar6 = (float *)(lVar27 + lVar28 * lVar1);
  pfVar7 = (float *)(lVar27 + lVar28 * lVar2);
  fVar255 = *pfVar7;
  fVar266 = pfVar7[1];
  fVar267 = pfVar7[2];
  fVar357 = pfVar7[3];
  fVar289 = *pfVar4 * 0.0;
  fVar365 = pfVar4[1] * 0.0;
  fVar232 = pfVar4[2] * 0.0;
  fVar308 = pfVar4[3] * 0.0;
  fVar269 = fVar216 * 0.0 + fVar289;
  fVar294 = fVar218 * 0.0 + fVar365;
  fVar345 = fVar219 * 0.0 + fVar232;
  fVar233 = fVar220 * 0.0 + fVar308;
  fVar410 = *pfVar3 * 0.0;
  fVar412 = pfVar3[1] * 0.0;
  fVar349 = pfVar3[2] * 0.0;
  fVar353 = pfVar3[3] * 0.0;
  fVar392 = fVar410 + fVar269 + fVar367;
  fVar393 = fVar412 + fVar294 + fVar119;
  fVar394 = fVar349 + fVar345 + fVar148;
  fVar395 = fVar353 + fVar233 + fVar191;
  fVar269 = (*pfVar3 * 3.0 + fVar269) - fVar367 * 3.0;
  fVar294 = (pfVar3[1] * 3.0 + fVar294) - fVar119 * 3.0;
  fVar345 = (pfVar3[2] * 3.0 + fVar345) - fVar148 * 3.0;
  fVar233 = (pfVar3[3] * 3.0 + fVar233) - fVar191 * 3.0;
  fVar411 = *pfVar6 * 0.0;
  fVar346 = pfVar6[1] * 0.0;
  fVar350 = pfVar6[2] * 0.0;
  fVar354 = pfVar6[3] * 0.0;
  fVar310 = fVar255 * 0.0 + fVar411;
  fVar313 = fVar266 * 0.0 + fVar346;
  fVar329 = fVar267 * 0.0 + fVar350;
  fVar332 = fVar357 * 0.0 + fVar354;
  fVar358 = *pfVar5 * 0.0;
  fVar366 = pfVar5[1] * 0.0;
  fVar368 = pfVar5[2] * 0.0;
  fVar369 = pfVar5[3] * 0.0;
  fVar371 = fVar358 + fVar310 + fVar229;
  fVar380 = fVar366 + fVar313 + fVar230;
  fVar382 = fVar368 + fVar329 + fVar190;
  fVar383 = fVar369 + fVar332 + fVar231;
  fVar401 = (*pfVar5 * 3.0 + fVar310) - fVar229 * 3.0;
  fVar402 = (pfVar5[1] * 3.0 + fVar313) - fVar230 * 3.0;
  fVar403 = (pfVar5[2] * 3.0 + fVar329) - fVar190 * 3.0;
  fVar404 = (pfVar5[3] * 3.0 + fVar332) - fVar231 * 3.0;
  fVar370 = fVar289 + fVar216 + fVar410 + fVar367 * 0.0;
  fVar379 = fVar365 + fVar218 + fVar412 + fVar119 * 0.0;
  fVar381 = fVar232 + fVar219 + fVar349 + fVar148 * 0.0;
  fVar384 = fVar308 + fVar220 + fVar353 + fVar191 * 0.0;
  fVar310 = ((fVar216 * 3.0 - *pfVar4 * 3.0) + fVar410) - fVar367 * 0.0;
  fVar313 = ((fVar218 * 3.0 - pfVar4[1] * 3.0) + fVar412) - fVar119 * 0.0;
  fVar329 = ((fVar219 * 3.0 - pfVar4[2] * 3.0) + fVar349) - fVar148 * 0.0;
  fVar332 = ((fVar220 * 3.0 - pfVar4[3] * 3.0) + fVar353) - fVar191 * 0.0;
  fVar216 = fVar411 + fVar255 + fVar358 + fVar229 * 0.0;
  fVar218 = fVar346 + fVar266 + fVar366 + fVar230 * 0.0;
  fVar219 = fVar350 + fVar267 + fVar368 + fVar190 * 0.0;
  fVar289 = fVar354 + fVar357 + fVar369 + fVar231 * 0.0;
  fVar367 = ((fVar255 * 3.0 - *pfVar6 * 3.0) + fVar358) - fVar229 * 0.0;
  fVar119 = ((fVar266 * 3.0 - pfVar6[1] * 3.0) + fVar366) - fVar230 * 0.0;
  fVar148 = ((fVar267 * 3.0 - pfVar6[2] * 3.0) + fVar368) - fVar190 * 0.0;
  fVar191 = ((fVar357 * 3.0 - pfVar6[3] * 3.0) + fVar369) - fVar231 * 0.0;
  fVar365 = fVar294 * fVar371 - fVar380 * fVar269;
  fVar308 = fVar345 * fVar380 - fVar382 * fVar294;
  fVar410 = fVar269 * fVar382 - fVar371 * fVar345;
  fVar411 = fVar233 * fVar383 - fVar383 * fVar233;
  fVar255 = fVar294 * fVar401 - fVar402 * fVar269;
  fVar267 = fVar345 * fVar402 - fVar403 * fVar294;
  fVar357 = fVar269 * fVar403 - fVar401 * fVar345;
  fVar220 = fVar313 * fVar216 - fVar218 * fVar310;
  fVar230 = fVar329 * fVar218 - fVar219 * fVar313;
  fVar190 = fVar310 * fVar219 - fVar216 * fVar329;
  fVar231 = fVar332 * fVar289 - fVar289 * fVar332;
  fVar216 = fVar313 * fVar367 - fVar119 * fVar310;
  fVar218 = fVar329 * fVar119 - fVar148 * fVar313;
  fVar148 = fVar310 * fVar148 - fVar367 * fVar329;
  fVar289 = fVar410 * fVar410 + fVar308 * fVar308 + fVar365 * fVar365;
  auVar235 = ZEXT416((uint)fVar289);
  auVar194 = rsqrtss(ZEXT416((uint)fVar289),auVar235);
  fVar367 = auVar194._0_4_;
  fVar232 = fVar367 * 1.5 - fVar367 * fVar367 * fVar289 * 0.5 * fVar367;
  fVar401 = fVar365 * fVar255 + fVar410 * fVar357 + fVar308 * fVar267;
  fVar367 = fVar411 * fVar232;
  auVar194 = rcpss(auVar235,auVar235);
  fVar266 = (2.0 - fVar289 * auVar194._0_4_) * auVar194._0_4_;
  fVar402 = fVar190 * fVar190 + fVar230 * fVar230 + fVar220 * fVar220;
  auVar194 = ZEXT416((uint)fVar402);
  auVar235 = rsqrtss(ZEXT416((uint)fVar402),auVar194);
  fVar119 = auVar235._0_4_;
  fVar229 = fVar119 * 1.5 - fVar119 * fVar119 * fVar402 * 0.5 * fVar119;
  fVar403 = fVar220 * fVar216 + fVar190 * fVar148 + fVar230 * fVar218;
  fVar219 = fVar231 * fVar229;
  auVar194 = rcpss(auVar194,auVar194);
  fVar119 = (2.0 - fVar402 * auVar194._0_4_) * auVar194._0_4_;
  fVar371 = fVar395 * fVar308 * fVar232;
  fVar383 = fVar395 * fVar410 * fVar232;
  fVar290 = fVar395 * fVar365 * fVar232;
  fVar292 = fVar395 * fVar367;
  fVar337 = fVar392 - fVar371;
  fVar347 = fVar393 - fVar383;
  fVar351 = fVar394 - fVar290;
  fVar355 = fVar395 - fVar292;
  fVar314 = fVar395 * fVar266 * (fVar289 * fVar267 - fVar401 * fVar308) * fVar232 +
            fVar233 * fVar308 * fVar232;
  fVar330 = fVar395 * fVar266 * (fVar289 * fVar357 - fVar401 * fVar410) * fVar232 +
            fVar233 * fVar410 * fVar232;
  fVar333 = fVar395 * fVar266 * (fVar289 * fVar255 - fVar401 * fVar365) * fVar232 +
            fVar233 * fVar365 * fVar232;
  fVar335 = fVar395 * fVar266 * (fVar289 * (fVar233 * fVar404 - fVar404 * fVar233) -
                                fVar401 * fVar411) * fVar232 + fVar233 * fVar367;
  fVar371 = fVar371 + fVar392;
  fVar383 = fVar383 + fVar393;
  fVar290 = fVar290 + fVar394;
  fVar292 = fVar292 + fVar395;
  fVar289 = fVar384 * fVar230 * fVar229;
  fVar365 = fVar384 * fVar190 * fVar229;
  fVar232 = fVar384 * fVar220 * fVar229;
  fVar308 = fVar384 * fVar219;
  fVar410 = fVar370 - fVar289;
  fVar346 = fVar379 - fVar365;
  fVar353 = fVar381 - fVar232;
  fVar366 = fVar384 - fVar308;
  fVar392 = fVar384 * fVar119 * (fVar402 * fVar218 - fVar403 * fVar230) * fVar229 +
            fVar332 * fVar230 * fVar229;
  fVar394 = fVar384 * fVar119 * (fVar402 * fVar148 - fVar403 * fVar190) * fVar229 +
            fVar332 * fVar190 * fVar229;
  fVar401 = fVar384 * fVar119 * (fVar402 * fVar216 - fVar403 * fVar220) * fVar229 +
            fVar332 * fVar220 * fVar229;
  fVar403 = fVar384 * fVar119 * (fVar402 * (fVar332 * fVar191 - fVar191 * fVar332) -
                                fVar403 * fVar231) * fVar229 + fVar332 * fVar219;
  fVar289 = fVar289 + fVar370;
  fVar365 = fVar365 + fVar379;
  fVar232 = fVar232 + fVar381;
  fVar308 = fVar308 + fVar384;
  lVar27 = *(long *)(_Var25 + 0x38 + lVar111);
  lVar28 = *(long *)(_Var25 + 0x48 + lVar111);
  pfVar3 = (float *)(lVar27 + lVar28 * uVar106);
  fVar367 = *pfVar3;
  fVar119 = pfVar3[1];
  fVar148 = pfVar3[2];
  fVar191 = pfVar3[3];
  pfVar3 = (float *)(lVar27 + lVar28 * lVar112);
  pfVar4 = (float *)(lVar27 + lVar28 * lVar1);
  pfVar5 = (float *)(lVar27 + lVar28 * lVar2);
  fVar216 = *pfVar5;
  fVar218 = pfVar5[1];
  fVar219 = pfVar5[2];
  fVar220 = pfVar5[3];
  lVar27 = *(long *)(lVar26 + 0x38 + lVar111);
  lVar26 = *(long *)(lVar26 + 0x48 + lVar111);
  uVar106 = uVar106 * lVar26;
  pfVar5 = (float *)(lVar27 + lVar26 * lVar2);
  fVar229 = *pfVar5;
  fVar230 = pfVar5[1];
  fVar190 = pfVar5[2];
  fVar231 = pfVar5[3];
  fVar393 = *pfVar4 * 0.0;
  fVar395 = pfVar4[1] * 0.0;
  fVar402 = pfVar4[2] * 0.0;
  fVar404 = pfVar4[3] * 0.0;
  fVar412 = fVar216 * 0.0 + fVar393;
  fVar350 = fVar218 * 0.0 + fVar395;
  fVar358 = fVar219 * 0.0 + fVar402;
  fVar369 = fVar220 * 0.0 + fVar404;
  fVar411 = *pfVar3 * 0.0;
  fVar349 = pfVar3[1] * 0.0;
  fVar354 = pfVar3[2] * 0.0;
  fVar368 = pfVar3[3] * 0.0;
  fVar370 = (*pfVar3 * 3.0 + fVar412) - fVar367 * 3.0;
  fVar379 = (pfVar3[1] * 3.0 + fVar350) - fVar119 * 3.0;
  fVar381 = (pfVar3[2] * 3.0 + fVar358) - fVar148 * 3.0;
  fVar384 = (pfVar3[3] * 3.0 + fVar369) - fVar191 * 3.0;
  pfVar3 = (float *)(lVar27 + lVar1 * lVar26);
  fVar315 = *pfVar3 * 0.0;
  fVar331 = pfVar3[1] * 0.0;
  fVar334 = pfVar3[2] * 0.0;
  fVar336 = pfVar3[3] * 0.0;
  fVar295 = fVar229 * 0.0 + fVar315;
  fVar309 = fVar230 * 0.0 + fVar331;
  fVar311 = fVar190 * 0.0 + fVar334;
  fVar312 = fVar231 * 0.0 + fVar336;
  pfVar5 = (float *)(lVar27 + lVar112 * lVar26);
  fVar338 = *pfVar5 * 0.0;
  fVar348 = pfVar5[1] * 0.0;
  fVar352 = pfVar5[2] * 0.0;
  fVar356 = pfVar5[3] * 0.0;
  pfVar6 = (float *)(lVar27 + uVar106);
  fVar255 = *pfVar6;
  fVar266 = pfVar6[1];
  fVar267 = pfVar6[2];
  fVar357 = pfVar6[3];
  fVar380 = (*pfVar5 * 3.0 + fVar295) - fVar255 * 3.0;
  fVar382 = (pfVar5[1] * 3.0 + fVar309) - fVar266 * 3.0;
  fVar291 = (pfVar5[2] * 3.0 + fVar311) - fVar267 * 3.0;
  fVar293 = (pfVar5[3] * 3.0 + fVar312) - fVar357 * 3.0;
  fVar412 = fVar411 + fVar412 + fVar367;
  fVar350 = fVar349 + fVar350 + fVar119;
  fVar358 = fVar354 + fVar358 + fVar148;
  fVar369 = fVar368 + fVar369 + fVar191;
  fVar393 = fVar393 + fVar216 + fVar411 + fVar367 * 0.0;
  fVar395 = fVar395 + fVar218 + fVar349 + fVar119 * 0.0;
  fVar402 = fVar402 + fVar219 + fVar354 + fVar148 * 0.0;
  fVar404 = fVar404 + fVar220 + fVar368 + fVar191 * 0.0;
  fVar367 = ((fVar216 * 3.0 - *pfVar4 * 3.0) + fVar411) - fVar367 * 0.0;
  fVar119 = ((fVar218 * 3.0 - pfVar4[1] * 3.0) + fVar349) - fVar119 * 0.0;
  fVar148 = ((fVar219 * 3.0 - pfVar4[2] * 3.0) + fVar354) - fVar148 * 0.0;
  fVar191 = ((fVar220 * 3.0 - pfVar4[3] * 3.0) + fVar368) - fVar191 * 0.0;
  fVar220 = fVar338 + fVar295 + fVar255;
  fVar295 = fVar348 + fVar309 + fVar266;
  fVar309 = fVar352 + fVar311 + fVar267;
  fVar311 = fVar356 + fVar312 + fVar357;
  fVar411 = fVar315 + fVar229 + fVar338 + fVar255 * 0.0;
  fVar349 = fVar331 + fVar230 + fVar348 + fVar266 * 0.0;
  fVar354 = fVar334 + fVar190 + fVar352 + fVar267 * 0.0;
  fVar368 = fVar336 + fVar231 + fVar356 + fVar357 * 0.0;
  fVar216 = ((fVar229 * 3.0 - *pfVar3 * 3.0) + fVar338) - fVar255 * 0.0;
  fVar218 = ((fVar230 * 3.0 - pfVar3[1] * 3.0) + fVar348) - fVar266 * 0.0;
  fVar219 = ((fVar190 * 3.0 - pfVar3[2] * 3.0) + fVar352) - fVar267 * 0.0;
  fVar231 = ((fVar231 * 3.0 - pfVar3[3] * 3.0) + fVar356) - fVar357 * 0.0;
  fVar190 = fVar379 * fVar220 - fVar295 * fVar370;
  fVar255 = fVar381 * fVar295 - fVar309 * fVar379;
  fVar309 = fVar370 * fVar309 - fVar220 * fVar381;
  fVar312 = fVar384 * fVar311 - fVar311 * fVar384;
  fVar220 = fVar379 * fVar380 - fVar382 * fVar370;
  fVar229 = fVar381 * fVar382 - fVar291 * fVar379;
  fVar230 = fVar370 * fVar291 - fVar380 * fVar381;
  fVar380 = fVar119 * fVar411 - fVar349 * fVar367;
  fVar291 = fVar148 * fVar349 - fVar354 * fVar119;
  fVar295 = fVar367 * fVar354 - fVar411 * fVar148;
  fVar311 = fVar191 * fVar368 - fVar368 * fVar191;
  fVar266 = fVar119 * fVar216 - fVar218 * fVar367;
  fVar357 = fVar148 * fVar218 - fVar219 * fVar119;
  fVar349 = fVar367 * fVar219 - fVar216 * fVar148;
  fVar216 = fVar309 * fVar309 + fVar255 * fVar255 + fVar190 * fVar190;
  auVar194 = ZEXT416((uint)fVar216);
  auVar235 = rsqrtss(ZEXT416((uint)fVar216),auVar194);
  fVar218 = auVar235._0_4_;
  fVar382 = fVar218 * 1.5 - fVar218 * fVar218 * fVar216 * 0.5 * fVar218;
  fVar336 = fVar190 * fVar220 + fVar309 * fVar230 + fVar255 * fVar229;
  auVar194 = rcpss(auVar194,auVar194);
  fVar218 = (2.0 - fVar216 * auVar194._0_4_) * auVar194._0_4_;
  fVar219 = fVar312 * fVar382;
  fVar315 = fVar295 * fVar295 + fVar291 * fVar291 + fVar380 * fVar380;
  auVar194 = ZEXT416((uint)fVar315);
  auVar235 = rsqrtss(ZEXT416((uint)fVar315),auVar194);
  fVar267 = auVar235._0_4_;
  fVar334 = fVar267 * 1.5 - fVar267 * fVar267 * fVar315 * 0.5 * fVar267;
  fVar338 = fVar380 * fVar266 + fVar295 * fVar349 + fVar291 * fVar357;
  auVar194 = rcpss(auVar194,auVar194);
  fVar348 = (2.0 - fVar315 * auVar194._0_4_) * auVar194._0_4_;
  fVar331 = fVar311 * fVar334;
  fVar267 = fVar369 * fVar255 * fVar382;
  fVar411 = fVar369 * fVar309 * fVar382;
  fVar354 = fVar369 * fVar190 * fVar382;
  fVar368 = fVar369 * fVar219;
  fVar229 = fVar369 * fVar218 * (fVar216 * fVar229 - fVar336 * fVar255) * fVar382 +
            fVar384 * fVar255 * fVar382;
  fVar230 = fVar369 * fVar218 * (fVar216 * fVar230 - fVar336 * fVar309) * fVar382 +
            fVar384 * fVar309 * fVar382;
  fVar190 = fVar369 * fVar218 * (fVar216 * fVar220 - fVar336 * fVar190) * fVar382 +
            fVar384 * fVar190 * fVar382;
  fVar255 = fVar369 * fVar218 * (fVar216 * (fVar384 * fVar293 - fVar293 * fVar384) -
                                fVar336 * fVar312) * fVar382 + fVar384 * fVar219;
  fVar382 = fVar412 - fVar267;
  fVar293 = fVar350 - fVar411;
  fVar309 = fVar358 - fVar354;
  fVar312 = fVar369 - fVar368;
  fVar267 = fVar267 + fVar412;
  fVar411 = fVar411 + fVar350;
  fVar354 = fVar354 + fVar358;
  fVar368 = fVar368 + fVar369;
  fVar216 = fVar404 * fVar291 * fVar334;
  fVar218 = fVar404 * fVar295 * fVar334;
  fVar219 = fVar404 * fVar380 * fVar334;
  fVar220 = fVar404 * fVar331;
  fVar350 = fVar404 * fVar348 * (fVar315 * fVar357 - fVar338 * fVar291) * fVar334 +
            fVar191 * fVar291 * fVar334;
  fVar349 = fVar404 * fVar348 * (fVar315 * fVar349 - fVar338 * fVar295) * fVar334 +
            fVar191 * fVar295 * fVar334;
  fVar358 = fVar404 * fVar348 * (fVar315 * fVar266 - fVar338 * fVar380) * fVar334 +
            fVar191 * fVar380 * fVar334;
  fVar369 = fVar404 * fVar348 * (fVar315 * (fVar191 * fVar231 - fVar231 * fVar191) -
                                fVar338 * fVar311) * fVar334 + fVar191 * fVar331;
  fVar231 = fVar393 - fVar216;
  fVar266 = fVar395 - fVar218;
  fVar357 = fVar402 - fVar219;
  fVar412 = fVar404 - fVar220;
  fVar216 = fVar216 + fVar393;
  fVar218 = fVar218 + fVar395;
  fVar219 = fVar219 + fVar402;
  fVar220 = fVar220 + fVar404;
  fVar393 = 1.0 - fVar147;
  local_388 = fVar337 * fVar393 + fVar382 * fVar147;
  fStack_384 = fVar347 * fVar393 + fVar293 * fVar147;
  fStack_380 = fVar351 * fVar393 + fVar309 * fVar147;
  fStack_37c = fVar355 * fVar393 + fVar312 * fVar147;
  local_398 = ((fVar269 - fVar314) * 0.33333334 + fVar337) * fVar393 +
              ((fVar370 - fVar229) * 0.33333334 + fVar382) * fVar147;
  fStack_394 = ((fVar294 - fVar330) * 0.33333334 + fVar347) * fVar393 +
               ((fVar379 - fVar230) * 0.33333334 + fVar293) * fVar147;
  fStack_390 = ((fVar345 - fVar333) * 0.33333334 + fVar351) * fVar393 +
               ((fVar381 - fVar190) * 0.33333334 + fVar309) * fVar147;
  fStack_38c = ((fVar233 - fVar335) * 0.33333334 + fVar355) * fVar393 +
               ((fVar384 - fVar255) * 0.33333334 + fVar312) * fVar147;
  local_3b8 = (fVar410 - (fVar310 - fVar392) * 0.33333334) * fVar393 +
              (fVar231 - (fVar367 - fVar350) * 0.33333334) * fVar147;
  fStack_3b4 = (fVar346 - (fVar313 - fVar394) * 0.33333334) * fVar393 +
               (fVar266 - (fVar119 - fVar349) * 0.33333334) * fVar147;
  fStack_3b0 = (fVar353 - (fVar329 - fVar401) * 0.33333334) * fVar393 +
               (fVar357 - (fVar148 - fVar358) * 0.33333334) * fVar147;
  fStack_3ac = (fVar366 - (fVar332 - fVar403) * 0.33333334) * fVar393 +
               (fVar412 - (fVar191 - fVar369) * 0.33333334) * fVar147;
  local_3a8 = fVar410 * fVar393 + fVar231 * fVar147;
  fStack_3a4 = fVar346 * fVar393 + fVar266 * fVar147;
  fStack_3a0 = fVar353 * fVar393 + fVar357 * fVar147;
  fStack_39c = fVar366 * fVar393 + fVar412 * fVar147;
  local_378 = fVar371 * fVar393 + fVar267 * fVar147;
  fStack_374 = fVar383 * fVar393 + fVar411 * fVar147;
  fStack_370 = fVar290 * fVar393 + fVar354 * fVar147;
  fStack_36c = fVar292 * fVar393 + fVar368 * fVar147;
  local_368 = ((fVar314 + fVar269) * 0.33333334 + fVar371) * fVar393 +
              ((fVar229 + fVar370) * 0.33333334 + fVar267) * fVar147;
  fStack_364 = ((fVar330 + fVar294) * 0.33333334 + fVar383) * fVar393 +
               ((fVar230 + fVar379) * 0.33333334 + fVar411) * fVar147;
  fStack_360 = ((fVar333 + fVar345) * 0.33333334 + fVar290) * fVar393 +
               ((fVar190 + fVar381) * 0.33333334 + fVar354) * fVar147;
  fStack_35c = ((fVar335 + fVar233) * 0.33333334 + fVar292) * fVar393 +
               ((fVar255 + fVar384) * 0.33333334 + fVar368) * fVar147;
  local_3c8 = (fVar289 - (fVar392 + fVar310) * 0.33333334) * fVar393 +
              (fVar216 - (fVar350 + fVar367) * 0.33333334) * fVar147;
  fStack_3c4 = (fVar365 - (fVar394 + fVar313) * 0.33333334) * fVar393 +
               (fVar218 - (fVar349 + fVar119) * 0.33333334) * fVar147;
  fStack_3c0 = (fVar232 - (fVar401 + fVar329) * 0.33333334) * fVar393 +
               (fVar219 - (fVar358 + fVar148) * 0.33333334) * fVar147;
  fStack_3bc = (fVar308 - (fVar403 + fVar332) * 0.33333334) * fVar393 +
               (fVar220 - (fVar369 + fVar191) * 0.33333334) * fVar147;
  local_218 = fVar393 * fVar289 + fVar147 * fVar216;
  fStack_214 = fVar393 * fVar365 + fVar147 * fVar218;
  fStack_210 = fVar393 * fVar232 + fVar147 * fVar219;
  fStack_20c = fVar393 * fVar308 + fVar147 * fVar220;
  fVar367 = (ray->org).field_0.m128[0];
  fVar119 = (ray->org).field_0.m128[1];
  fVar147 = (ray->org).field_0.m128[2];
  fVar148 = (pre->ray_space).vx.field_0.m128[0];
  fVar191 = (pre->ray_space).vx.field_0.m128[1];
  fVar216 = (pre->ray_space).vy.field_0.m128[0];
  fVar218 = (pre->ray_space).vy.field_0.m128[1];
  fVar219 = (pre->ray_space).vz.field_0.m128[0];
  fVar220 = (pre->ray_space).vz.field_0.m128[1];
  fVar255 = (local_388 - fVar367) * fVar148 +
            (fStack_384 - fVar119) * fVar216 + (fStack_380 - fVar147) * fVar219;
  fVar266 = (local_388 - fVar367) * fVar191 +
            (fStack_384 - fVar119) * fVar218 + (fStack_380 - fVar147) * fVar220;
  local_328._0_8_ = CONCAT44(fVar266,fVar255);
  fVar190 = (local_398 - fVar367) * fVar148 +
            (fStack_394 - fVar119) * fVar216 + (fStack_390 - fVar147) * fVar219;
  fVar231 = (local_398 - fVar367) * fVar191 +
            (fStack_394 - fVar119) * fVar218 + (fStack_390 - fVar147) * fVar220;
  local_338._0_8_ = CONCAT44(fVar231,fVar190);
  fVar229 = (local_3b8 - fVar367) * fVar148 +
            (fStack_3b4 - fVar119) * fVar216 + (fStack_3b0 - fVar147) * fVar219;
  fVar230 = (local_3b8 - fVar367) * fVar191 +
            (fStack_3b4 - fVar119) * fVar218 + (fStack_3b0 - fVar147) * fVar220;
  local_348 = CONCAT44(fVar230,fVar229);
  fVar269 = (local_3a8 - fVar367) * fVar148 +
            (fStack_3a4 - fVar119) * fVar216 + (fStack_3a0 - fVar147) * fVar219;
  fVar289 = (local_3a8 - fVar367) * fVar191 +
            (fStack_3a4 - fVar119) * fVar218 + (fStack_3a0 - fVar147) * fVar220;
  local_2d8 = CONCAT44(fVar289,fVar269);
  local_2e8 = (local_378 - fVar367) * fVar148 +
              (fStack_374 - fVar119) * fVar216 + (fStack_370 - fVar147) * fVar219;
  fStack_2e4 = (local_378 - fVar367) * fVar191 +
               (fStack_374 - fVar119) * fVar218 + (fStack_370 - fVar147) * fVar220;
  fVar267 = (local_368 - fVar367) * fVar148 +
            (fStack_364 - fVar119) * fVar216 + (fStack_360 - fVar147) * fVar219;
  fVar357 = (local_368 - fVar367) * fVar191 +
            (fStack_364 - fVar119) * fVar218 + (fStack_360 - fVar147) * fVar220;
  uStack_2b0 = CONCAT44(fVar357,fVar267);
  local_308 = (local_3c8 - fVar367) * fVar148 +
              (fStack_3c4 - fVar119) * fVar216 + (fStack_3c0 - fVar147) * fVar219;
  fStack_304 = (local_3c8 - fVar367) * fVar191 +
               (fStack_3c4 - fVar119) * fVar218 + (fStack_3c0 - fVar147) * fVar220;
  fVar148 = (local_218 - fVar367) * fVar148 +
            (fStack_214 - fVar119) * fVar216 + (fStack_210 - fVar147) * fVar219;
  fVar367 = (local_218 - fVar367) * fVar191 +
            (fStack_214 - fVar119) * fVar218 + (fStack_210 - fVar147) * fVar220;
  local_318 = CONCAT44(fVar367,fVar148);
  auVar360._8_8_ = uStack_2b0;
  auVar360._0_8_ = local_338._0_8_;
  local_b8._8_8_ = local_318;
  local_b8._0_8_ = local_2d8;
  auVar132._8_4_ = local_2e8;
  auVar132._0_8_ = local_328._0_8_;
  auVar132._12_4_ = fStack_2e4;
  auVar194 = minps(auVar132,auVar360);
  auVar171._8_4_ = local_308;
  auVar171._0_8_ = local_348;
  auVar171._12_4_ = fStack_304;
  auVar235 = minps(auVar171,local_b8);
  auVar194 = minps(auVar194,auVar235);
  auVar172._4_4_ = fVar266;
  auVar172._0_4_ = fVar255;
  auVar172._8_4_ = local_2e8;
  auVar172._12_4_ = fStack_2e4;
  auVar235 = maxps(auVar172,auVar360);
  auVar205._4_4_ = fVar230;
  auVar205._0_4_ = fVar229;
  auVar205._8_4_ = local_308;
  auVar205._12_4_ = fStack_304;
  auVar206 = maxps(auVar205,local_b8);
  auVar173 = maxps(auVar235,auVar206);
  auVar31._4_8_ = auVar206._8_8_;
  auVar31._0_4_ = auVar194._4_4_;
  auVar207._0_8_ = auVar31._0_8_ << 0x20;
  auVar207._8_4_ = auVar194._8_4_;
  auVar207._12_4_ = auVar194._12_4_;
  auVar208._8_8_ = auVar194._8_8_;
  auVar208._0_8_ = auVar207._8_8_;
  auVar235 = minps(auVar194,auVar208);
  auVar32._4_8_ = auVar194._8_8_;
  auVar32._0_4_ = auVar173._4_4_;
  auVar209._0_8_ = auVar32._0_8_ << 0x20;
  auVar209._8_4_ = auVar173._8_4_;
  auVar209._12_4_ = auVar173._12_4_;
  auVar210._8_8_ = auVar173._8_8_;
  auVar210._0_8_ = auVar209._8_8_;
  auVar194 = maxps(auVar173,auVar210);
  auVar133._0_8_ = auVar235._0_8_ & 0x7fffffff7fffffff;
  auVar133._8_4_ = auVar235._8_4_ & 0x7fffffff;
  auVar133._12_4_ = auVar235._12_4_ & 0x7fffffff;
  auVar174._0_8_ = auVar194._0_8_ & 0x7fffffff7fffffff;
  auVar174._8_4_ = auVar194._8_4_ & 0x7fffffff;
  auVar174._12_4_ = auVar194._12_4_ & 0x7fffffff;
  auVar194 = maxps(auVar133,auVar174);
  fStack_c4 = auVar194._4_4_;
  local_c8 = fStack_c4;
  if (fStack_c4 <= auVar194._0_4_) {
    local_c8 = auVar194._0_4_;
  }
  local_c8 = local_c8 * 9.536743e-07;
  local_328._8_8_ = local_328._0_8_;
  local_338._8_8_ = local_338._0_8_;
  register0x00001588 = local_2d8;
  register0x00001288 = uStack_2b0;
  local_2f8 = uStack_2b0;
  register0x00001348 = local_318;
  fStack_c0 = fStack_c4;
  fStack_bc = fStack_c4;
  _local_298 = CONCAT44(fStack_2e4,local_2e8);
  local_88 = fVar190 - fVar255;
  fStack_84 = fVar231 - fVar266;
  fStack_80 = fVar267 - local_2e8;
  fStack_7c = fVar357 - fStack_2e4;
  local_98 = fVar229 - fVar190;
  fStack_94 = fVar230 - fVar231;
  fStack_90 = local_308 - fVar267;
  fStack_8c = fStack_304 - fVar357;
  fStack_2b4 = fStack_304;
  local_2b8 = local_308;
  local_a8 = fVar269 - fVar229;
  fStack_a4 = fVar289 - fVar230;
  fStack_a0 = fVar148 - local_308;
  fStack_9c = fVar367 - fStack_304;
  local_198 = local_378 - local_388;
  fStack_194 = fStack_374 - fStack_384;
  fStack_190 = fStack_370 - fStack_380;
  fStack_18c = fStack_36c - fStack_37c;
  local_1a8 = local_368 - local_398;
  fStack_1a4 = fStack_364 - fStack_394;
  fStack_1a0 = fStack_360 - fStack_390;
  fStack_19c = fStack_35c - fStack_38c;
  local_1b8 = local_3c8 - local_3b8;
  fStack_1b4 = fStack_3c4 - fStack_3b4;
  fStack_1b0 = fStack_3c0 - fStack_3b0;
  fStack_1ac = fStack_3bc - fStack_3ac;
  local_1c8 = local_218 - local_3a8;
  fStack_1c4 = fStack_214 - fStack_3a4;
  fStack_1c0 = fStack_210 - fStack_3a0;
  fStack_1bc = fStack_20c - fStack_39c;
  bVar113 = 0;
  uVar108 = 0;
  local_418._0_4_ = 0.0;
  local_418._4_4_ = 1.0;
  fStack_410 = 0.0;
  fStack_40c = 0.0;
  fVar147 = 0.0;
  fVar148 = 1.0;
  local_158 = local_c8;
  fStack_154 = local_c8;
  fStack_150 = local_c8;
  fStack_14c = local_c8;
  local_168 = -local_c8;
  fStack_164 = -local_c8;
  fStack_160 = -local_c8;
  fStack_15c = -local_c8;
  fVar367 = fVar229;
  fVar119 = fVar230;
  uStack_340 = local_348;
  fStack_300 = local_308;
  fStack_2fc = fStack_304;
  fStack_2e0 = local_2e8;
  fStack_2dc = fStack_2e4;
  local_2c8 = local_348;
  local_2a8 = local_328._0_8_;
LAB_0036e102:
  fVar191 = 1.0 - (float)local_418._0_4_;
  fVar216 = 1.0 - (float)local_418._0_4_;
  fVar218 = 1.0 - (float)local_418._4_4_;
  fVar219 = 1.0 - (float)local_418._4_4_;
  fVar269 = local_328._0_4_ * fVar191 + local_2e8 * (float)local_418._0_4_;
  fVar233 = local_328._4_4_ * fVar216 + fStack_2e4 * (float)local_418._0_4_;
  fVar308 = local_328._8_4_ * fVar218 + fStack_2e0 * (float)local_418._4_4_;
  fVar329 = local_328._12_4_ * fVar219 + fStack_2dc * (float)local_418._4_4_;
  fVar220 = local_338._0_4_ * fVar191 + local_2f8._0_4_ * (float)local_418._0_4_;
  fVar365 = local_338._4_4_ * fVar216 + local_2f8._4_4_ * (float)local_418._0_4_;
  fVar345 = local_338._8_4_ * fVar218 + local_2f8._8_4_ * (float)local_418._4_4_;
  fVar232 = local_338._12_4_ * fVar219 + local_2f8._12_4_ * (float)local_418._4_4_;
  fVar393 = fVar229 * fVar191 + local_308 * (float)local_418._0_4_;
  fVar394 = fVar230 * fVar216 + fStack_304 * (float)local_418._0_4_;
  fVar395 = fVar367 * fVar218 + fStack_300 * (float)local_418._4_4_;
  fVar401 = fVar119 * fVar219 + fStack_2fc * (float)local_418._4_4_;
  fVar310 = fVar191 * local_2d8._0_4_ + (float)local_418._0_4_ * local_318._0_4_;
  fVar313 = fVar216 * local_2d8._4_4_ + (float)local_418._0_4_ * local_318._4_4_;
  fVar332 = fVar218 * local_2d8._8_4_ + (float)local_418._4_4_ * local_318._8_4_;
  fVar370 = fVar219 * local_2d8._12_4_ + (float)local_418._4_4_ * local_318._12_4_;
  fVar379 = (fVar148 - fVar147) * 0.11111111;
  local_408 = CONCAT44(fVar148,fVar147);
  fVar381 = (fVar148 - fVar147) * 0.0 + fVar147;
  fVar384 = (fVar148 - fVar147) * 0.33333334 + fVar147;
  fVar392 = (fVar148 - fVar147) * 0.6666667 + fVar147;
  fVar147 = (fVar148 - fVar147) * 1.0 + fVar147;
  fVar367 = 1.0 - fVar381;
  fVar119 = 1.0 - fVar384;
  fVar148 = 1.0 - fVar392;
  fVar219 = 1.0 - fVar147;
  fVar229 = fVar220 * fVar367 + fVar393 * fVar381;
  fVar230 = fVar220 * fVar119 + fVar393 * fVar384;
  fVar190 = fVar220 * fVar148 + fVar393 * fVar392;
  fVar231 = fVar220 * fVar219 + fVar393 * fVar147;
  fVar255 = fVar365 * fVar367 + fVar394 * fVar381;
  fVar266 = fVar365 * fVar119 + fVar394 * fVar384;
  fVar267 = fVar365 * fVar148 + fVar394 * fVar392;
  fVar357 = fVar365 * fVar219 + fVar394 * fVar147;
  fVar191 = (fVar269 * fVar367 + fVar220 * fVar381) * fVar367 + fVar381 * fVar229;
  fVar216 = (fVar269 * fVar119 + fVar220 * fVar384) * fVar119 + fVar384 * fVar230;
  fVar218 = (fVar269 * fVar148 + fVar220 * fVar392) * fVar148 + fVar392 * fVar190;
  fVar220 = (fVar269 * fVar219 + fVar220 * fVar147) * fVar219 + fVar147 * fVar231;
  fVar269 = (fVar233 * fVar367 + fVar365 * fVar381) * fVar367 + fVar381 * fVar255;
  fVar289 = (fVar233 * fVar119 + fVar365 * fVar384) * fVar119 + fVar384 * fVar266;
  fVar294 = (fVar233 * fVar148 + fVar365 * fVar392) * fVar148 + fVar392 * fVar267;
  fVar365 = (fVar233 * fVar219 + fVar365 * fVar147) * fVar219 + fVar147 * fVar357;
  fVar229 = fVar229 * fVar367 + (fVar393 * fVar367 + fVar310 * fVar381) * fVar381;
  fVar230 = fVar230 * fVar119 + (fVar393 * fVar119 + fVar310 * fVar384) * fVar384;
  fVar190 = fVar190 * fVar148 + (fVar393 * fVar148 + fVar310 * fVar392) * fVar392;
  fVar231 = fVar231 * fVar219 + (fVar393 * fVar219 + fVar310 * fVar147) * fVar147;
  fVar255 = fVar255 * fVar367 + (fVar394 * fVar367 + fVar313 * fVar381) * fVar381;
  fVar266 = fVar266 * fVar119 + (fVar394 * fVar119 + fVar313 * fVar384) * fVar384;
  fVar267 = fVar267 * fVar148 + (fVar394 * fVar148 + fVar313 * fVar392) * fVar392;
  fVar357 = fVar357 * fVar219 + (fVar394 * fVar219 + fVar313 * fVar147) * fVar147;
  local_258 = fVar367 * fVar191 + fVar381 * fVar229;
  fStack_254 = fVar119 * fVar216 + fVar384 * fVar230;
  fStack_250 = fVar148 * fVar218 + fVar392 * fVar190;
  fStack_24c = fVar219 * fVar220 + fVar147 * fVar231;
  local_148 = fVar367 * fVar269 + fVar381 * fVar255;
  fStack_144 = fVar119 * fVar289 + fVar384 * fVar266;
  fStack_140 = fVar148 * fVar294 + fVar392 * fVar267;
  fStack_13c = fVar219 * fVar365 + fVar147 * fVar357;
  fVar216 = (fVar230 - fVar216) * 3.0 * fVar379;
  fVar218 = (fVar190 - fVar218) * 3.0 * fVar379;
  fVar220 = (fVar231 - fVar220) * 3.0 * fVar379;
  fVar230 = (fVar266 - fVar289) * 3.0 * fVar379;
  fVar190 = (fVar267 - fVar294) * 3.0 * fVar379;
  fVar231 = (fVar357 - fVar365) * 3.0 * fVar379;
  local_228._4_4_ = fStack_250;
  local_228._0_4_ = fStack_254;
  local_228._8_4_ = fStack_24c;
  local_228._12_4_ = 0;
  local_e8._4_4_ = fStack_140;
  local_e8._0_4_ = fStack_144;
  local_238 = local_258 + (fVar229 - fVar191) * 3.0 * fVar379;
  fStack_234 = fStack_254 + fVar216;
  fStack_230 = fStack_250 + fVar218;
  fStack_22c = fStack_24c + fVar220;
  local_358._0_4_ = local_148 + (fVar255 - fVar269) * 3.0 * fVar379;
  local_358._4_4_ = fStack_144 + fVar230;
  fStack_350 = fStack_140 + fVar190;
  fStack_34c = fStack_13c + fVar231;
  local_248._0_4_ = fStack_254 - fVar216;
  local_248._4_4_ = fStack_250 - fVar218;
  local_248._8_4_ = fStack_24c - fVar220;
  local_248._12_4_ = 0;
  auVar134._0_4_ = fStack_144 - fVar230;
  auVar134._4_4_ = fStack_140 - fVar190;
  auVar134._8_4_ = fStack_13c - fVar231;
  auVar134._12_4_ = 0;
  fVar191 = fVar345 * fVar367 + fVar395 * fVar381;
  fVar216 = fVar345 * fVar119 + fVar395 * fVar384;
  fVar218 = fVar345 * fVar148 + fVar395 * fVar392;
  fVar220 = fVar345 * fVar219 + fVar395 * fVar147;
  fVar229 = fVar232 * fVar367 + fVar401 * fVar381;
  fVar230 = fVar232 * fVar119 + fVar401 * fVar384;
  fVar190 = fVar232 * fVar148 + fVar401 * fVar392;
  fVar233 = fVar232 * fVar219 + fVar401 * fVar147;
  fVar231 = (fVar308 * fVar367 + fVar345 * fVar381) * fVar367 + fVar381 * fVar191;
  fVar255 = (fVar308 * fVar119 + fVar345 * fVar384) * fVar119 + fVar384 * fVar216;
  fVar266 = (fVar308 * fVar148 + fVar345 * fVar392) * fVar148 + fVar392 * fVar218;
  fVar267 = (fVar308 * fVar219 + fVar345 * fVar147) * fVar219 + fVar147 * fVar220;
  fVar308 = (fVar329 * fVar367 + fVar232 * fVar381) * fVar367 + fVar381 * fVar229;
  fVar310 = (fVar329 * fVar119 + fVar232 * fVar384) * fVar119 + fVar384 * fVar230;
  fVar313 = (fVar329 * fVar148 + fVar232 * fVar392) * fVar148 + fVar392 * fVar190;
  fVar329 = (fVar329 * fVar219 + fVar232 * fVar147) * fVar219 + fVar147 * fVar233;
  fVar357 = fVar191 * fVar367 + (fVar395 * fVar367 + fVar332 * fVar381) * fVar381;
  fVar269 = fVar216 * fVar119 + (fVar395 * fVar119 + fVar332 * fVar384) * fVar384;
  fVar289 = fVar218 * fVar148 + (fVar395 * fVar148 + fVar332 * fVar392) * fVar392;
  fVar294 = fVar220 * fVar219 + (fVar395 * fVar219 + fVar332 * fVar147) * fVar147;
  fVar365 = fVar229 * fVar367 + (fVar401 * fVar367 + fVar370 * fVar381) * fVar381;
  fVar345 = fVar230 * fVar119 + (fVar401 * fVar119 + fVar370 * fVar384) * fVar384;
  fVar232 = fVar190 * fVar148 + (fVar401 * fVar148 + fVar370 * fVar392) * fVar392;
  fVar233 = fVar233 * fVar219 + (fVar401 * fVar219 + fVar370 * fVar147) * fVar147;
  fVar220 = fVar367 * fVar231 + fVar381 * fVar357;
  fVar229 = fVar119 * fVar255 + fVar384 * fVar269;
  fVar230 = fVar148 * fVar266 + fVar392 * fVar289;
  fVar190 = fVar219 * fVar267 + fVar147 * fVar294;
  fVar191 = fVar367 * fVar308 + fVar381 * fVar365;
  fVar216 = fVar119 * fVar310 + fVar384 * fVar345;
  fVar218 = fVar148 * fVar313 + fVar392 * fVar232;
  fVar219 = fVar219 * fVar329 + fVar147 * fVar233;
  fVar367 = (fVar269 - fVar255) * 3.0 * fVar379;
  fVar119 = (fVar289 - fVar266) * 3.0 * fVar379;
  fVar147 = (fVar294 - fVar267) * 3.0 * fVar379;
  fVar148 = (fVar345 - fVar310) * 3.0 * fVar379;
  fVar255 = (fVar232 - fVar313) * 3.0 * fVar379;
  fVar266 = (fVar233 - fVar329) * 3.0 * fVar379;
  local_f8._4_4_ = fVar230;
  local_f8._0_4_ = fVar229;
  local_f8._8_4_ = fVar190;
  local_f8._12_4_ = 0;
  local_118._4_4_ = fVar218;
  local_118._0_4_ = fVar216;
  local_118._8_4_ = fVar219;
  local_118._12_4_ = 0;
  local_138 = fVar220 + (fVar357 - fVar231) * 3.0 * fVar379;
  fStack_134 = fVar229 + fVar367;
  fStack_130 = fVar230 + fVar119;
  fStack_12c = fVar190 + fVar147;
  local_108 = fVar191 + (fVar365 - fVar308) * 3.0 * fVar379;
  fStack_104 = fVar216 + fVar148;
  fStack_100 = fVar218 + fVar255;
  fStack_fc = fVar219 + fVar266;
  local_d8._0_4_ = fVar229 - fVar367;
  local_d8._4_4_ = fVar230 - fVar119;
  local_d8._8_4_ = fVar190 - fVar147;
  local_d8._12_4_ = 0;
  local_128._0_4_ = fVar216 - fVar148;
  local_128._4_4_ = fVar218 - fVar255;
  local_128._8_4_ = fVar219 - fVar266;
  local_128._12_4_ = 0;
  fVar367 = (fVar229 - fStack_254) + (fVar220 - local_258);
  fVar119 = (fVar230 - fStack_250) + (fVar229 - fStack_254);
  fVar147 = (fVar190 - fStack_24c) + (fVar230 - fStack_250);
  fVar148 = (fVar190 - fStack_24c) + 0.0;
  local_e8._8_4_ = fStack_13c;
  local_e8._12_4_ = 0;
  fVar231 = (fVar216 - fStack_144) + (fVar191 - local_148);
  fVar255 = (fVar218 - fStack_140) + (fVar216 - fStack_144);
  fVar266 = (fVar219 - fStack_13c) + (fVar218 - fStack_140);
  fVar267 = (fVar219 - fStack_13c) + 0.0;
  auVar282._0_8_ =
       CONCAT44(fStack_144 * fVar119 - fStack_254 * fVar255,
                local_148 * fVar367 - local_258 * fVar231);
  auVar282._8_4_ = fStack_140 * fVar147 - fStack_250 * fVar266;
  auVar282._12_4_ = fStack_13c * fVar148 - fStack_24c * fVar267;
  auVar245._0_4_ = (float)local_358._0_4_ * fVar367 - local_238 * fVar231;
  auVar245._4_4_ = (float)local_358._4_4_ * fVar119 - fStack_234 * fVar255;
  auVar245._8_4_ = fStack_350 * fVar147 - fStack_230 * fVar266;
  auVar245._12_4_ = fStack_34c * fVar148 - fStack_22c * fVar267;
  auVar257._0_8_ =
       CONCAT44(auVar134._4_4_ * fVar119 - fVar255 * local_248._4_4_,
                auVar134._0_4_ * fVar367 - fVar231 * local_248._0_4_);
  auVar257._8_4_ = auVar134._8_4_ * fVar147 - fVar266 * local_248._8_4_;
  auVar257._12_4_ = fVar148 * 0.0 - fVar267 * 0.0;
  auVar376._0_4_ = fVar367 * fStack_144 - fVar231 * fStack_254;
  auVar376._4_4_ = fVar119 * fStack_140 - fVar255 * fStack_250;
  auVar376._8_4_ = fVar147 * fStack_13c - fVar266 * fStack_24c;
  auVar376._12_4_ = fVar148 * 0.0 - fVar267 * 0.0;
  auVar322._0_8_ =
       CONCAT44(fVar216 * fVar119 - fVar229 * fVar255,fVar191 * fVar367 - fVar220 * fVar231);
  auVar322._8_4_ = fVar218 * fVar147 - fVar230 * fVar266;
  auVar322._12_4_ = fVar219 * fVar148 - fVar190 * fVar267;
  auVar391._0_4_ = local_108 * fVar367 - local_138 * fVar231;
  auVar391._4_4_ = fStack_104 * fVar119 - fStack_134 * fVar255;
  auVar391._8_4_ = fStack_100 * fVar147 - fStack_130 * fVar266;
  auVar391._12_4_ = fStack_fc * fVar148 - fStack_12c * fVar267;
  auVar299._0_8_ =
       CONCAT44(local_128._4_4_ * fVar119 - fVar255 * local_d8._4_4_,
                local_128._0_4_ * fVar367 - fVar231 * local_d8._0_4_);
  auVar299._8_4_ = local_128._8_4_ * fVar147 - fVar266 * local_d8._8_4_;
  auVar299._12_4_ = fVar148 * 0.0 - fVar267 * 0.0;
  auVar137._0_4_ = fVar367 * fVar216 - fVar231 * fVar229;
  auVar137._4_4_ = fVar119 * fVar218 - fVar255 * fVar230;
  auVar137._8_4_ = fVar147 * fVar219 - fVar266 * fVar190;
  auVar137._12_4_ = fVar148 * 0.0 - fVar267 * 0.0;
  auVar175._8_4_ = auVar282._8_4_;
  auVar175._0_8_ = auVar282._0_8_;
  auVar175._12_4_ = auVar282._12_4_;
  auVar194 = minps(auVar175,auVar245);
  auVar173 = maxps(auVar282,auVar245);
  auVar246._8_4_ = auVar257._8_4_;
  auVar246._0_8_ = auVar257._0_8_;
  auVar246._12_4_ = auVar257._12_4_;
  auVar235 = minps(auVar246,auVar376);
  auVar194 = minps(auVar194,auVar235);
  auVar235 = maxps(auVar257,auVar376);
  auVar206 = maxps(auVar173,auVar235);
  auVar247._8_4_ = auVar322._8_4_;
  auVar247._0_8_ = auVar322._0_8_;
  auVar247._12_4_ = auVar322._12_4_;
  auVar235 = minps(auVar247,auVar391);
  auVar323 = maxps(auVar322,auVar391);
  auVar258._8_4_ = auVar299._8_4_;
  auVar258._0_8_ = auVar299._0_8_;
  auVar258._12_4_ = auVar299._12_4_;
  auVar173 = minps(auVar258,auVar137);
  auVar235 = minps(auVar235,auVar173);
  auVar194 = minps(auVar194,auVar235);
  auVar235 = maxps(auVar299,auVar137);
  auVar235 = maxps(auVar323,auVar235);
  auVar235 = maxps(auVar206,auVar235);
  bVar114 = auVar194._4_4_ <= fStack_154;
  bVar29 = auVar194._8_4_ <= fStack_150;
  bVar30 = auVar194._12_4_ <= fStack_14c;
  auVar94._4_4_ = -(uint)bVar29;
  auVar94._0_4_ = -(uint)bVar114;
  auVar94._8_4_ = -(uint)bVar30;
  auVar94._12_4_ = 0;
  auVar179 = auVar94 << 0x20;
  auVar283._0_4_ =
       -(uint)(local_168 <= auVar235._0_4_ && auVar194._0_4_ <= local_158) & local_178._0_4_;
  auVar283._4_4_ = -(uint)(fStack_164 <= auVar235._4_4_ && bVar114) & local_178._4_4_;
  auVar283._8_4_ = -(uint)(fStack_160 <= auVar235._8_4_ && bVar29) & local_178._8_4_;
  auVar283._12_4_ = -(uint)(fStack_15c <= auVar235._12_4_ && bVar30) & local_178._12_4_;
  uVar116 = movmskps((int)uVar106,auVar283);
  uVar106 = (ulong)uVar116;
  if (uVar116 != 0) {
    fVar367 = (fVar229 - fVar220) + (fStack_254 - local_258);
    fVar119 = (fVar230 - fVar229) + (fStack_250 - fStack_254);
    fVar147 = (fVar190 - fVar230) + (fStack_24c - fStack_250);
    fVar148 = (0.0 - fVar190) + (0.0 - fStack_24c);
    fVar231 = (fVar216 - fVar191) + (fStack_144 - local_148);
    fVar255 = (fVar218 - fVar216) + (fStack_140 - fStack_144);
    fVar266 = (fVar219 - fVar218) + (fStack_13c - fStack_140);
    fVar267 = (0.0 - fVar219) + (0.0 - fStack_13c);
    auVar398._0_8_ =
         CONCAT44(fStack_144 * fVar119 - fStack_254 * fVar255,
                  local_148 * fVar367 - local_258 * fVar231);
    auVar398._8_4_ = fStack_140 * fVar147 - fStack_250 * fVar266;
    auVar398._12_4_ = fStack_13c * fVar148 - fStack_24c * fVar267;
    auVar248._0_4_ = (float)local_358._0_4_ * fVar367 - local_238 * fVar231;
    auVar248._4_4_ = (float)local_358._4_4_ * fVar119 - fStack_234 * fVar255;
    auVar248._8_4_ = fStack_350 * fVar147 - fStack_230 * fVar266;
    auVar248._12_4_ = fStack_34c * fVar148 - fStack_22c * fVar267;
    auVar300._0_8_ =
         CONCAT44(auVar134._4_4_ * fVar119 - local_248._4_4_ * fVar255,
                  auVar134._0_4_ * fVar367 - local_248._0_4_ * fVar231);
    auVar300._8_4_ = auVar134._8_4_ * fVar147 - local_248._8_4_ * fVar266;
    auVar300._12_4_ = fVar148 * 0.0 - fVar267 * 0.0;
    auVar259._0_4_ = fStack_144 * fVar367 - fStack_254 * fVar231;
    auVar259._4_4_ = fStack_140 * fVar119 - fStack_250 * fVar255;
    auVar259._8_4_ = fStack_13c * fVar147 - fStack_24c * fVar266;
    auVar259._12_4_ = fVar148 * 0.0 - fVar267 * 0.0;
    auVar211._0_8_ =
         CONCAT44(fVar216 * fVar119 - fVar229 * fVar255,fVar191 * fVar367 - fVar220 * fVar231);
    auVar211._8_4_ = fVar218 * fVar147 - fVar230 * fVar266;
    auVar211._12_4_ = fVar219 * fVar148 - fVar190 * fVar267;
    auVar340._0_4_ = local_108 * fVar367 - local_138 * fVar231;
    auVar340._4_4_ = fStack_104 * fVar119 - fStack_134 * fVar255;
    auVar340._8_4_ = fStack_100 * fVar147 - fStack_130 * fVar266;
    auVar340._12_4_ = fStack_fc * fVar148 - fStack_12c * fVar267;
    auVar377._0_8_ =
         CONCAT44(local_128._4_4_ * fVar119 - local_d8._4_4_ * fVar255,
                  local_128._0_4_ * fVar367 - local_d8._0_4_ * fVar231);
    auVar377._8_4_ = local_128._8_4_ * fVar147 - local_d8._8_4_ * fVar266;
    auVar377._12_4_ = fVar148 * 0.0 - fVar267 * 0.0;
    auVar137._0_4_ = fVar367 * fVar216 - fVar231 * fVar229;
    auVar137._4_4_ = fVar119 * fVar218 - fVar255 * fVar230;
    auVar137._8_4_ = fVar147 * fVar219 - fVar266 * fVar190;
    auVar137._12_4_ = fVar148 * 0.0 - fVar267 * 0.0;
    auVar176._8_4_ = auVar398._8_4_;
    auVar176._0_8_ = auVar398._0_8_;
    auVar176._12_4_ = auVar398._12_4_;
    auVar194 = minps(auVar176,auVar248);
    auVar173 = maxps(auVar398,auVar248);
    auVar249._8_4_ = auVar300._8_4_;
    auVar249._0_8_ = auVar300._0_8_;
    auVar249._12_4_ = auVar300._12_4_;
    auVar235 = minps(auVar249,auVar259);
    auVar194 = minps(auVar194,auVar235);
    auVar235 = maxps(auVar300,auVar259);
    auVar323 = maxps(auVar173,auVar235);
    auVar250._8_4_ = auVar211._8_4_;
    auVar250._0_8_ = auVar211._0_8_;
    auVar250._12_4_ = auVar211._12_4_;
    auVar173 = minps(auVar250,auVar340);
    auVar235 = maxps(auVar211,auVar340);
    auVar260._8_4_ = auVar377._8_4_;
    auVar260._0_8_ = auVar377._0_8_;
    auVar260._12_4_ = auVar377._12_4_;
    auVar206 = minps(auVar260,auVar137);
    auVar173 = minps(auVar173,auVar206);
    auVar194 = minps(auVar194,auVar173);
    auVar173 = maxps(auVar377,auVar137);
    auVar235 = maxps(auVar235,auVar173);
    auVar235 = maxps(auVar323,auVar235);
    bVar114 = auVar194._4_4_ <= fStack_154;
    bVar29 = auVar194._8_4_ <= fStack_150;
    bVar30 = auVar194._12_4_ <= fStack_14c;
    auVar95._4_4_ = -(uint)bVar29;
    auVar95._0_4_ = -(uint)bVar114;
    auVar95._8_4_ = -(uint)bVar30;
    auVar95._12_4_ = 0;
    auVar179 = auVar95 << 0x20;
    auVar399._0_4_ =
         -(uint)(local_168 <= auVar235._0_4_ && auVar194._0_4_ <= local_158) & auVar283._0_4_;
    auVar399._4_4_ = -(uint)(fStack_164 <= auVar235._4_4_ && bVar114) & auVar283._4_4_;
    auVar399._8_4_ = -(uint)(fStack_160 <= auVar235._8_4_ && bVar29) & auVar283._8_4_;
    auVar399._12_4_ = -(uint)(fStack_15c <= auVar235._12_4_ && bVar30) & auVar283._12_4_;
    uVar116 = movmskps(uVar116,auVar399);
    uVar106 = (ulong)uVar116;
    auVar391 = local_118;
    if (uVar116 != 0) {
      uVar106 = (ulong)(byte)uVar116;
      auStack_208[uVar108] = uVar116 & 0xff;
      *(undefined8 *)(afStack_78 + uVar108 * 2) = local_408;
      *(undefined1 (*) [8])(afStack_58 + uVar108 * 2) = local_418;
      uVar108 = (ulong)((int)uVar108 + 1);
      auVar137 = _local_418;
    }
  }
LAB_0036e763:
  _local_3f8 = auVar134;
  auVar194 = _local_3f8;
  if ((int)uVar108 == 0) {
    if (bVar113 != 0) goto LAB_0036f82b;
    fVar367 = ray->tfar;
    auVar184._4_4_ = -(uint)(fStack_184 <= fVar367);
    auVar184._0_4_ = -(uint)(local_188 <= fVar367);
    auVar184._8_4_ = -(uint)(fStack_180 <= fVar367);
    auVar184._12_4_ = -(uint)(fStack_17c <= fVar367);
    uVar115 = movmskps((int)uVar106,auVar184);
    uVar110 = (ulong)((uint)uVar110 & (uint)uVar110 + 0xf & uVar115);
    goto LAB_0036d436;
  }
  uVar117 = (int)uVar108 - 1;
  uVar106 = (ulong)uVar117;
  uVar116 = auStack_208[uVar106];
  local_418._0_4_ = afStack_58[uVar106 * 2];
  local_418._4_4_ = afStack_58[uVar106 * 2 + 1];
  fStack_410 = 0.0;
  fStack_40c = 0.0;
  uVar14 = 0;
  if (uVar116 != 0) {
    for (; (uVar116 >> uVar14 & 1) == 0; uVar14 = uVar14 + 1) {
    }
  }
  uVar116 = uVar116 - 1 & uVar116;
  auStack_208[uVar106] = uVar116;
  if (uVar116 == 0) {
    uVar108 = (ulong)uVar117;
  }
  fVar148 = (float)(uVar14 + 1) * 0.33333334;
  fVar191 = auVar137._4_4_ * 0.0;
  fVar216 = auVar179._4_4_ * 0.0;
  fVar367 = afStack_78[uVar106 * 2];
  fVar119 = afStack_78[uVar106 * 2 + 1];
  fVar147 = fVar367 * (1.0 - (float)uVar14 * 0.33333334) + fVar119 * (float)uVar14 * 0.33333334;
  fVar148 = fVar367 * (1.0 - fVar148) + fVar119 * fVar148;
  fVar218 = fVar367 * (0.0 - fVar191) + fVar119 * fVar191;
  fVar216 = fVar367 * (0.0 - fVar216) + fVar119 * fVar216;
  fVar191 = fVar148 - fVar147;
  fVar229 = (float)local_348;
  fVar230 = local_348._4_4_;
  fVar367 = (float)uStack_340;
  fVar119 = uStack_340._4_4_;
  if (fVar191 < 0.16666667) {
    fVar266 = 1.0 - (float)local_418._0_4_;
    fVar357 = 1.0 - (float)local_418._0_4_;
    fVar294 = 1.0 - (float)local_418._4_4_;
    fVar365 = 1.0 - (float)local_418._4_4_;
    fVar255 = local_328._0_4_ * fVar266 + local_2e8 * (float)local_418._0_4_;
    fVar267 = local_328._4_4_ * fVar357 + fStack_2e4 * (float)local_418._0_4_;
    fVar269 = local_328._8_4_ * fVar294 + fStack_2e0 * (float)local_418._4_4_;
    fVar289 = local_328._12_4_ * fVar365 + fStack_2dc * (float)local_418._4_4_;
    fVar219 = local_338._0_4_ * fVar266 + (float)local_2f8._0_4_ * (float)local_418._0_4_;
    fVar220 = local_338._4_4_ * fVar357 + (float)local_2f8._4_4_ * (float)local_418._0_4_;
    fVar190 = local_338._8_4_ * fVar294 + fStack_2f0 * (float)local_418._4_4_;
    fVar231 = local_338._12_4_ * fVar365 + fStack_2ec * (float)local_418._4_4_;
    fVar310 = (float)local_348 * fVar266 + local_308 * (float)local_418._0_4_;
    fVar329 = local_348._4_4_ * fVar357 + fStack_304 * (float)local_418._0_4_;
    fVar370 = (float)uStack_340 * fVar294 + fStack_300 * (float)local_418._4_4_;
    fVar381 = uStack_340._4_4_ * fVar365 + fStack_2fc * (float)local_418._4_4_;
    fVar345 = (fVar266 * (float)local_2d8._0_4_ + (float)local_418._0_4_ * (float)local_318._0_4_) -
              fVar310;
    fVar232 = (fVar357 * (float)local_2d8._4_4_ + (float)local_418._0_4_ * (float)local_318._4_4_) -
              fVar329;
    fVar233 = (fVar294 * fStack_2d0 + (float)local_418._4_4_ * fStack_310) - fVar370;
    fVar308 = (fVar365 * fStack_2cc + (float)local_418._4_4_ * fStack_30c) - fVar381;
    fVar266 = fVar147 * (fVar310 - fVar219) + fVar219;
    fVar357 = fVar147 * (fVar329 - fVar220) + fVar220;
    fVar294 = fVar147 * (fVar370 - fVar190) + fVar190;
    fVar365 = fVar147 * (fVar381 - fVar231) + fVar231;
    fVar313 = (fVar310 - fVar219) * fVar148 + fVar219;
    fVar332 = (fVar329 - fVar220) * fVar148 + fVar220;
    fVar379 = (fVar370 - fVar190) * fVar148 + fVar190;
    fVar384 = (fVar381 - fVar231) * fVar148 + fVar231;
    fVar392 = fVar147 * (fVar219 - fVar255) + fVar255;
    fVar393 = fVar147 * (fVar220 - fVar267) + fVar267;
    fVar394 = fVar147 * (fVar190 - fVar269) + fVar269;
    fVar395 = fVar147 * (fVar231 - fVar289) + fVar289;
    fVar392 = (fVar266 - fVar392) * fVar147 + fVar392;
    fVar393 = (fVar357 - fVar393) * fVar147 + fVar393;
    fVar394 = (fVar294 - fVar394) * fVar147 + fVar394;
    fVar395 = (fVar365 - fVar395) * fVar147 + fVar395;
    fVar266 = (((fVar147 * fVar345 + fVar310) - fVar266) * fVar147 + fVar266) - fVar392;
    fVar357 = (((fVar147 * fVar232 + fVar329) - fVar357) * fVar147 + fVar357) - fVar393;
    fVar294 = (((fVar147 * fVar233 + fVar370) - fVar294) * fVar147 + fVar294) - fVar394;
    fVar365 = (((fVar147 * fVar308 + fVar381) - fVar365) * fVar147 + fVar365) - fVar395;
    auVar212._0_4_ = fVar147 * fVar266 + fVar392;
    auVar212._4_4_ = fVar147 * fVar357 + fVar393;
    auVar212._8_4_ = fVar147 * fVar294 + fVar394;
    auVar212._12_4_ = fVar147 * fVar365 + fVar395;
    fVar255 = (fVar219 - fVar255) * fVar148 + fVar255;
    fVar267 = (fVar220 - fVar267) * fVar148 + fVar267;
    fVar269 = (fVar190 - fVar269) * fVar148 + fVar269;
    fVar289 = (fVar231 - fVar289) * fVar148 + fVar289;
    fVar255 = (fVar313 - fVar255) * fVar148 + fVar255;
    fVar267 = (fVar332 - fVar267) * fVar148 + fVar267;
    fVar269 = (fVar379 - fVar269) * fVar148 + fVar269;
    fVar289 = (fVar384 - fVar289) * fVar148 + fVar289;
    fVar220 = (((fVar345 * fVar148 + fVar310) - fVar313) * fVar148 + fVar313) - fVar255;
    fVar190 = (((fVar232 * fVar148 + fVar329) - fVar332) * fVar148 + fVar332) - fVar267;
    fVar231 = (((fVar233 * fVar148 + fVar370) - fVar379) * fVar148 + fVar379) - fVar269;
    fVar332 = (((fVar308 * fVar148 + fVar381) - fVar384) * fVar148 + fVar384) - fVar289;
    fVar255 = fVar148 * fVar220 + fVar255;
    fVar267 = fVar148 * fVar190 + fVar267;
    fVar269 = fVar148 * fVar231 + fVar269;
    fVar289 = fVar148 * fVar332 + fVar289;
    fVar219 = fVar191 * 0.33333334;
    fVar345 = fVar266 * (float)DAT_01f4afa0 * fVar219 + auVar212._0_4_;
    fVar232 = fVar357 * DAT_01f4afa0._4_4_ * fVar219 + auVar212._4_4_;
    fVar233 = fVar294 * DAT_01f4afa0._8_4_ * fVar219 + auVar212._8_4_;
    fVar308 = fVar365 * DAT_01f4afa0._12_4_ * fVar219 + auVar212._12_4_;
    fVar310 = fVar255 - fVar219 * fVar220 * (float)DAT_01f4afa0;
    fVar313 = fVar267 - fVar219 * fVar190 * DAT_01f4afa0._4_4_;
    fVar329 = fVar269 - fVar219 * fVar231 * DAT_01f4afa0._8_4_;
    fVar332 = fVar289 - fVar219 * fVar332 * DAT_01f4afa0._12_4_;
    auVar33._4_8_ = auVar391._8_8_;
    auVar33._0_4_ = auVar212._4_4_;
    auVar388._0_8_ = auVar33._0_8_ << 0x20;
    auVar388._8_4_ = auVar212._8_4_;
    auVar388._12_4_ = auVar212._12_4_;
    auVar389._8_8_ = auVar212._8_8_;
    auVar389._0_8_ = auVar388._8_8_;
    auVar34._4_8_ = DAT_01f4afa0._8_8_;
    auVar34._0_4_ = fVar267;
    auVar301._0_8_ = auVar34._0_8_ << 0x20;
    auVar301._8_4_ = fVar269;
    auVar301._12_4_ = fVar289;
    fVar266 = (fVar269 - fVar255) + (auVar212._8_4_ - auVar212._0_4_);
    fVar357 = (fVar289 - fVar267) + (auVar212._12_4_ - auVar212._4_4_);
    auVar324._0_4_ = fVar313 * fVar357;
    auVar324._4_4_ = fVar313 * fVar357;
    auVar324._8_4_ = fVar332 * fVar357;
    auVar324._12_4_ = fVar332 * fVar357;
    fVar219 = auVar212._0_4_ * fVar266 + auVar212._4_4_ * fVar357;
    fVar220 = auVar212._8_4_ * fVar266 + auVar212._12_4_ * fVar357;
    fVar294 = fVar345 * fVar266 + fVar232 * fVar357;
    fVar365 = fVar233 * fVar266 + fVar308 * fVar357;
    fVar370 = fVar310 * fVar266 + auVar324._0_4_;
    auVar284._0_8_ = CONCAT44(fVar313 * fVar266 + auVar324._4_4_,fVar370);
    auVar284._8_4_ = fVar329 * fVar266 + auVar324._8_4_;
    auVar284._12_4_ = fVar332 * fVar266 + auVar324._12_4_;
    fVar231 = fVar266 * fVar255 + fVar357 * fVar267;
    fVar379 = fVar266 * fVar269 + fVar357 * fVar289;
    auVar35._4_8_ = auVar324._8_8_;
    auVar35._0_4_ = fVar232 * fVar266 + fVar232 * fVar357;
    auVar325._0_8_ = auVar35._0_8_ << 0x20;
    auVar325._8_4_ = fVar365;
    auVar325._12_4_ = fVar308 * fVar266 + fVar308 * fVar357;
    fVar190 = fVar294;
    if (fVar294 <= fVar219) {
      fVar190 = fVar219;
      fVar219 = fVar294;
    }
    auVar326._8_8_ = auVar325._8_8_;
    auVar326._0_8_ = auVar326._8_8_;
    auVar135._8_4_ = auVar284._8_4_;
    auVar135._0_8_ = auVar284._0_8_;
    auVar135._12_4_ = auVar284._12_4_;
    if (fVar231 <= fVar370) {
      auVar135._0_4_ = fVar231;
    }
    if (auVar135._0_4_ <= fVar219) {
      fVar219 = auVar135._0_4_;
    }
    auVar36._4_8_ = auVar135._8_8_;
    auVar36._0_4_ = fVar266 * fVar267 + fVar357 * fVar267;
    auVar136._0_8_ = auVar36._0_8_ << 0x20;
    auVar136._8_4_ = fVar379;
    auVar136._12_4_ = fVar266 * fVar289 + fVar357 * fVar289;
    if (fVar231 <= fVar370) {
      fVar231 = fVar370;
    }
    auVar137._8_8_ = auVar136._8_8_;
    auVar137._0_8_ = auVar137._8_8_;
    if (fVar231 <= fVar190) {
      fVar231 = fVar190;
    }
    if (fVar365 <= fVar220) {
      auVar326._0_4_ = fVar220;
      fVar220 = fVar365;
    }
    auVar177._8_4_ = auVar284._8_4_;
    auVar177._0_8_ = auVar284._8_8_;
    auVar177._12_4_ = auVar284._12_4_;
    if (fVar379 <= auVar284._8_4_) {
      auVar177._0_4_ = fVar379;
    }
    if (auVar177._0_4_ <= fVar220) {
      fVar220 = auVar177._0_4_;
    }
    if (fVar379 <= auVar284._8_4_) {
      auVar137._0_4_ = auVar284._8_4_;
    }
    if (auVar137._0_4_ <= auVar326._0_4_) {
      auVar137._0_4_ = auVar326._0_4_;
    }
    bVar114 = 3 < (uint)uVar108;
    uVar37 = (undefined3)(uVar117 >> 8);
    uVar106 = (ulong)CONCAT31(uVar37,bVar114);
    fVar190 = auVar137._0_4_;
    auVar391 = auVar389;
    if ((0.0001 <= fVar219) || (fVar190 <= -0.0001)) goto LAB_0036ea75;
    goto LAB_0036eabe;
  }
  goto LAB_0036e102;
LAB_0036ea75:
  auVar179._0_12_ = ZEXT812(0x38d1b717);
  auVar179._12_4_ = 0.0;
  if ((0.0001 <= fVar220 || fVar231 <= -0.0001) &&
     ((0.0001 <= fVar219 || fVar231 <= -0.0001 &&
      (auVar134 = _local_3f8, 0.0001 <= fVar220 || fVar190 <= -0.0001)))) goto LAB_0036e763;
LAB_0036eabe:
  local_3f8 = (undefined1  [8])auVar301._8_8_;
  auVar134 = _local_3f8;
  bVar114 = bVar114 || fVar191 < 0.001;
  uVar106 = (ulong)CONCAT31(uVar37,bVar114);
  fVar357 = (float)(~-(uint)(fVar219 < 0.0) & 0x3f800000 | -(uint)(fVar219 < 0.0) & 0xbf800000);
  fVar294 = (float)(~-(uint)(fVar231 < 0.0) & 0x3f800000 | -(uint)(fVar231 < 0.0) & 0xbf800000);
  fVar266 = 0.0;
  if ((fVar357 == fVar294) && (!NAN(fVar357) && !NAN(fVar294))) {
    fVar266 = INFINITY;
  }
  fVar365 = 0.0;
  if ((fVar357 == fVar294) && (!NAN(fVar357) && !NAN(fVar294))) {
    fVar365 = -INFINITY;
  }
  fVar370 = (float)(~-(uint)(fVar220 < 0.0) & 0x3f800000 | -(uint)(fVar220 < 0.0) & 0xbf800000);
  if ((fVar357 != fVar370) || (fVar379 = fVar365, NAN(fVar357) || NAN(fVar370))) {
    if ((fVar220 != fVar219) || (NAN(fVar220) || NAN(fVar219))) {
      fVar220 = -fVar219 / (fVar220 - fVar219);
      fVar220 = (1.0 - fVar220) * 0.0 + fVar220;
      fVar379 = fVar220;
    }
    else {
      fVar220 = 0.0;
      if ((fVar219 != 0.0) || (fVar379 = 1.0, NAN(fVar219))) {
        fVar220 = INFINITY;
        fVar379 = -INFINITY;
      }
    }
    if (fVar220 <= fVar266) {
      fVar266 = fVar220;
    }
    if (fVar379 <= fVar365) {
      fVar379 = fVar365;
    }
  }
  fVar219 = *(float *)(&DAT_01f4bed4 + (ulong)(fVar190 < 0.0) * 4);
  if ((fVar294 != fVar219) || (fVar220 = fVar379, NAN(fVar294) || NAN(fVar219))) {
    if ((fVar190 != fVar231) || (NAN(fVar190) || NAN(fVar231))) {
      fVar357 = -fVar231 / (fVar190 - fVar231);
      fVar357 = (1.0 - fVar357) * 0.0 + fVar357;
      fVar220 = fVar357;
    }
    else {
      fVar357 = 0.0;
      if ((fVar231 != 0.0) || (fVar220 = 1.0, NAN(fVar231))) {
        fVar357 = INFINITY;
        fVar220 = -INFINITY;
      }
    }
    if (fVar357 <= fVar266) {
      fVar266 = fVar357;
    }
    if (fVar220 <= fVar379) {
      fVar220 = fVar379;
    }
  }
  if ((fVar370 != fVar219) || (NAN(fVar370) || NAN(fVar219))) {
    fVar266 = (float)(~-(uint)(fVar266 < 1.0) & 0x3f800000 | (uint)fVar266 & -(uint)(fVar266 < 1.0))
    ;
    fVar220 = (float)(~-(uint)(fVar220 < 1.0) & (uint)fVar220 | -(uint)(fVar220 < 1.0) & 0x3f800000)
    ;
  }
  fStack_3f0 = auVar194._8_4_;
  fStack_3ec = auVar194._12_4_;
  auVar178._0_8_ =
       CONCAT44(~-(uint)(fVar220 < 1.0),~-(uint)(fVar266 < 0.0) & (uint)fVar266) &
       0x3f800000ffffffff;
  auVar178._8_8_ = 0;
  auVar179 = auVar178 | ZEXT416((uint)fVar220 & -(uint)(fVar220 < 1.0)) << 0x20;
  fVar219 = auVar179._4_4_;
  auVar137._4_4_ = fVar219;
  auVar137._0_4_ = fVar219;
  auVar137._8_4_ = fVar219;
  auVar137._12_4_ = fVar219;
  _local_358 = auVar389;
  if (fVar219 < auVar179._0_4_) goto LAB_0036e763;
  fVar220 = auVar179._0_4_ + -0.1;
  fVar231 = auVar179._8_4_ + 0.0;
  fVar266 = auVar179._12_4_ + 0.0;
  uVar116 = -(uint)(fVar219 + 0.1 < 1.0);
  fVar220 = (float)(~-(uint)(fVar220 < 0.0) & (uint)fVar220);
  fVar219 = (float)(~uVar116 & 0x3f800000 | (uint)(fVar219 + 0.1) & uVar116);
  fVar384 = 1.0 - fVar220;
  fVar392 = 1.0 - fVar220;
  fVar393 = 1.0 - fVar219;
  fVar394 = 1.0 - fVar219;
  fVar357 = auVar212._0_4_ * fVar384 + auVar212._8_4_ * fVar220;
  fVar294 = auVar212._4_4_ * fVar392 + auVar212._12_4_ * fVar220;
  fVar365 = auVar212._0_4_ * fVar393 + auVar212._8_4_ * fVar219;
  fVar370 = auVar212._4_4_ * fVar394 + auVar212._12_4_ * fVar219;
  fVar379 = fVar345 * fVar384 + fVar233 * fVar220;
  fVar381 = fVar232 * fVar392 + fVar308 * fVar220;
  fVar345 = fVar345 * fVar393 + fVar233 * fVar219;
  fVar232 = fVar232 * fVar394 + fVar308 * fVar219;
  fVar233 = fVar310 * fVar384 + fVar329 * fVar220;
  fVar308 = fVar313 * fVar392 + fVar332 * fVar220;
  fVar310 = fVar310 * fVar393 + fVar329 * fVar219;
  fVar313 = fVar313 * fVar394 + fVar332 * fVar219;
  fVar269 = fVar384 * fVar255 + fVar269 * fVar220;
  fVar289 = fVar392 * fVar267 + fVar289 * fVar220;
  fVar329 = fVar393 * fVar255 + fStack_3f0 * fVar219;
  fVar332 = fVar394 * fVar267 + fStack_3ec * fVar219;
  fVar255 = (float)local_418._4_4_ * fVar231;
  fVar267 = (float)local_418._4_4_ * fVar266;
  fVar384 = (float)local_418._0_4_ * (1.0 - fVar219);
  fStack_410 = (float)local_418._0_4_ * (0.0 - fVar231);
  fStack_40c = (float)local_418._0_4_ * (0.0 - fVar266);
  local_418._0_4_ = (float)local_418._0_4_ * (1.0 - fVar220) + (float)local_418._4_4_ * fVar220;
  local_418._4_4_ = fVar384 + (float)local_418._4_4_ * fVar219;
  fStack_410 = fStack_410 + fVar255;
  fStack_40c = fStack_40c + fVar267;
  fVar191 = 1.0 / fVar191;
  auVar180._0_4_ = fVar329 - fVar269;
  auVar180._4_4_ = fVar332 - fVar289;
  auVar180._8_4_ = fVar329 - fVar329;
  auVar180._12_4_ = fVar332 - fVar332;
  auVar226._0_8_ = CONCAT44(fVar313 - fVar308,fVar310 - fVar233);
  auVar226._8_4_ = fVar310 - fVar310;
  auVar226._12_4_ = fVar313 - fVar313;
  auVar261._0_4_ = fVar345 - fVar379;
  auVar261._4_4_ = fVar232 - fVar381;
  auVar261._8_4_ = fVar345 - fVar345;
  auVar261._12_4_ = fVar232 - fVar232;
  auVar327._0_8_ = CONCAT44((fVar381 - fVar294) * 3.0,(fVar379 - fVar357) * 3.0);
  auVar327._8_4_ = (fVar345 - fVar365) * 3.0;
  auVar327._12_4_ = (fVar232 - fVar370) * 3.0;
  auVar251._0_8_ = CONCAT44((fVar308 - fVar381) * 3.0,(fVar233 - fVar379) * 3.0);
  auVar251._8_4_ = (fVar310 - fVar345) * 3.0;
  auVar251._12_4_ = (fVar313 - fVar232) * 3.0;
  auVar361._0_4_ = (fVar269 - fVar233) * 3.0;
  auVar361._4_4_ = (fVar289 - fVar308) * 3.0;
  auVar361._8_4_ = (fVar329 - fVar310) * 3.0;
  auVar361._12_4_ = (fVar332 - fVar313) * 3.0;
  auVar285._8_4_ = auVar251._8_4_;
  auVar285._0_8_ = auVar251._0_8_;
  auVar285._12_4_ = auVar251._12_4_;
  auVar235 = minps(auVar285,auVar361);
  auVar194 = maxps(auVar251,auVar361);
  auVar341._8_4_ = auVar327._8_4_;
  auVar341._0_8_ = auVar327._0_8_;
  auVar341._12_4_ = auVar327._12_4_;
  auVar206 = minps(auVar341,auVar235);
  auVar173 = maxps(auVar327,auVar194);
  auVar38._4_8_ = auVar194._8_8_;
  auVar38._0_4_ = auVar206._4_4_;
  auVar252._0_8_ = auVar38._0_8_ << 0x20;
  auVar252._8_4_ = auVar206._8_4_;
  auVar252._12_4_ = auVar206._12_4_;
  auVar253._8_8_ = auVar206._8_8_;
  auVar253._0_8_ = auVar252._8_8_;
  auVar39._4_8_ = auVar235._8_8_;
  auVar39._0_4_ = auVar173._4_4_;
  auVar286._0_8_ = auVar39._0_8_ << 0x20;
  auVar286._8_4_ = auVar173._8_4_;
  auVar286._12_4_ = auVar173._12_4_;
  auVar287._8_8_ = auVar173._8_8_;
  auVar287._0_8_ = auVar286._8_8_;
  auVar235 = minps(auVar206,auVar253);
  auVar194 = maxps(auVar173,auVar287);
  fVar392 = auVar235._0_4_ * fVar191;
  fVar393 = auVar235._4_4_ * fVar191;
  fVar394 = auVar235._8_4_ * fVar191;
  fVar395 = auVar235._12_4_ * fVar191;
  fVar232 = fVar191 * auVar194._0_4_;
  fVar308 = fVar191 * auVar194._4_4_;
  fVar313 = fVar191 * auVar194._8_4_;
  fVar191 = fVar191 * auVar194._12_4_;
  fVar381 = 1.0 / ((float)local_418._4_4_ - (float)local_418._0_4_);
  auVar138._0_8_ = CONCAT44(fVar370 - fVar294,fVar365 - fVar357);
  auVar138._8_4_ = fVar365 - fVar365;
  auVar138._12_4_ = fVar370 - fVar370;
  auVar302._8_4_ = auVar138._8_4_;
  auVar302._0_8_ = auVar138._0_8_;
  auVar302._12_4_ = auVar138._12_4_;
  auVar173 = minps(auVar302,auVar261);
  auVar194 = maxps(auVar138,auVar261);
  auVar213._8_4_ = auVar226._8_4_;
  auVar213._0_8_ = auVar226._0_8_;
  auVar213._12_4_ = auVar226._12_4_;
  auVar235 = minps(auVar213,auVar180);
  auVar173 = minps(auVar173,auVar235);
  auVar235 = maxps(auVar226,auVar180);
  auVar194 = maxps(auVar194,auVar235);
  fVar370 = auVar173._0_4_ * fVar381;
  fVar379 = auVar173._4_4_ * fVar381;
  fVar384 = fVar381 * auVar194._0_4_;
  fVar381 = fVar381 * auVar194._4_4_;
  local_3f8._4_4_ = local_418._0_4_;
  local_3f8._0_4_ = fVar147;
  fStack_3f0 = fVar148;
  fStack_3ec = (float)local_418._4_4_;
  auVar288._4_4_ = local_418._4_4_;
  auVar288._0_4_ = fVar148;
  auVar288._8_4_ = fVar218;
  auVar288._12_4_ = fVar216;
  fVar289 = (fVar147 + fVar148) * 0.5;
  fVar294 = ((float)local_418._0_4_ + (float)local_418._4_4_) * 0.5;
  fVar365 = (fVar148 + fVar218) * 0.0;
  fVar345 = ((float)local_418._4_4_ + fVar216) * 0.0;
  fVar219 = local_88 * fVar289 + (float)local_2a8;
  fVar220 = fStack_84 * fVar289 + local_2a8._4_4_;
  fVar231 = fStack_80 * fVar289 + fStack_2a0;
  fVar255 = fStack_7c * fVar289 + fStack_29c;
  fVar266 = local_98 * fVar289 + local_2b8;
  fVar267 = fStack_94 * fVar289 + fStack_2b4;
  fVar357 = fStack_90 * fVar289 + (float)uStack_2b0;
  fVar269 = fStack_8c * fVar289 + uStack_2b0._4_4_;
  fVar219 = (fVar266 - fVar219) * fVar289 + fVar219;
  fVar220 = (fVar267 - fVar220) * fVar289 + fVar220;
  fVar231 = (fVar357 - fVar231) * fVar289 + fVar231;
  fVar255 = (fVar269 - fVar255) * fVar289 + fVar255;
  fVar266 = (((local_a8 * fVar289 + (float)local_2c8) - fVar266) * fVar289 + fVar266) - fVar219;
  fVar267 = (((fStack_a4 * fVar289 + local_2c8._4_4_) - fVar267) * fVar289 + fVar267) - fVar220;
  fVar357 = (((fStack_a0 * fVar289 + fStack_2c0) - fVar357) * fVar289 + fVar357) - fVar231;
  fVar269 = (((fStack_9c * fVar289 + fStack_2bc) - fVar269) * fVar289 + fVar269) - fVar255;
  fVar219 = fVar289 * fVar266 + fVar219;
  fVar220 = fVar289 * fVar267 + fVar220;
  fVar266 = fVar266 * 3.0;
  fVar267 = fVar267 * 3.0;
  fVar231 = (fVar289 * fVar357 + fVar231) - fVar219;
  fVar255 = (fVar289 * fVar269 + fVar255) - fVar220;
  fVar266 = (fVar357 * 3.0 - fVar266) * fVar294 + fVar266;
  fVar267 = (fVar269 * 3.0 - fVar267) * fVar294 + fVar267;
  auVar227._0_8_ = CONCAT44(fVar266,fVar231) ^ 0x80000000;
  auVar227._8_4_ = fVar266;
  auVar227._12_4_ = fVar266;
  fVar401 = fVar147 - fVar289;
  fVar402 = (float)local_418._0_4_ - fVar294;
  fVar403 = fVar148 - fVar365;
  fVar404 = (float)local_418._4_4_ - fVar345;
  fVar410 = fVar148 - fVar289;
  fVar411 = (float)local_418._4_4_ - fVar294;
  fVar218 = fVar218 - fVar365;
  fVar216 = fVar216 - fVar345;
  fVar219 = fVar231 * fVar294 + fVar219;
  fVar220 = fVar255 * fVar294 + fVar220;
  auVar254._0_8_ = CONCAT44(fVar267,fVar255) ^ 0x8000000000000000;
  auVar254._8_4_ = -fVar267;
  auVar254._12_4_ = -fVar267;
  auVar139._0_4_ = fVar255 * fVar266 - fVar267 * fVar231;
  auVar139._4_4_ = auVar139._0_4_;
  auVar139._8_4_ = auVar139._0_4_;
  auVar139._12_4_ = auVar139._0_4_;
  auVar235 = divps(auVar254,auVar139);
  auVar194 = divps(auVar227,auVar139);
  fVar365 = auVar235._0_4_;
  fVar345 = auVar235._4_4_;
  fVar357 = auVar194._0_4_;
  fVar269 = auVar194._4_4_;
  fVar289 = fVar289 - (fVar220 * fVar357 + fVar219 * fVar365);
  fVar266 = fVar294 - (fVar220 * fVar269 + fVar219 * fVar345);
  fVar267 = fVar294 - (fVar220 * auVar194._8_4_ + fVar219 * auVar235._8_4_);
  fVar294 = fVar294 - (fVar220 * auVar194._12_4_ + fVar219 * auVar235._12_4_);
  auVar181._0_8_ = CONCAT44(fVar345 * fVar370,fVar345 * fVar392);
  auVar181._8_4_ = fVar345 * fVar393;
  auVar181._12_4_ = fVar345 * fVar379;
  auVar140._0_4_ = fVar345 * fVar232;
  auVar140._4_4_ = fVar345 * fVar384;
  auVar140._8_4_ = fVar345 * fVar308;
  auVar140._12_4_ = fVar345 * fVar381;
  auVar409._8_4_ = auVar181._8_4_;
  auVar409._0_8_ = auVar181._0_8_;
  auVar409._12_4_ = auVar181._12_4_;
  auVar206 = minps(auVar409,auVar140);
  auVar194 = maxps(auVar140,auVar181);
  auVar262._0_8_ = CONCAT44(fVar269 * fVar379,fVar269 * fVar393);
  auVar262._8_4_ = fVar269 * fVar394;
  auVar262._12_4_ = fVar269 * fVar395;
  auVar182._0_4_ = fVar269 * fVar308;
  auVar182._4_4_ = fVar269 * fVar381;
  auVar182._8_4_ = fVar269 * fVar313;
  auVar182._12_4_ = fVar269 * fVar191;
  auVar342._8_4_ = auVar262._8_4_;
  auVar342._0_8_ = auVar262._0_8_;
  auVar342._12_4_ = auVar262._12_4_;
  auVar173 = minps(auVar342,auVar182);
  auVar235 = maxps(auVar182,auVar262);
  fVar219 = 0.0 - (auVar235._0_4_ + auVar194._0_4_);
  fVar220 = 1.0 - (auVar235._4_4_ + auVar194._4_4_);
  fVar231 = 0.0 - (auVar235._8_4_ + auVar194._8_4_);
  fVar255 = 0.0 - (auVar235._12_4_ + auVar194._12_4_);
  fVar233 = 0.0 - (auVar173._0_4_ + auVar206._0_4_);
  fVar310 = 1.0 - (auVar173._4_4_ + auVar206._4_4_);
  fVar329 = 0.0 - (auVar173._8_4_ + auVar206._8_4_);
  fVar332 = 0.0 - (auVar173._12_4_ + auVar206._12_4_);
  auVar183._0_8_ = CONCAT44(fVar402 * fVar220,fVar401 * fVar219);
  auVar183._8_4_ = fVar403 * fVar231;
  auVar183._12_4_ = fVar404 * fVar255;
  auVar362._0_8_ = CONCAT44(fVar370 * fVar365,fVar392 * fVar365);
  auVar362._8_4_ = fVar393 * fVar365;
  auVar362._12_4_ = fVar379 * fVar365;
  auVar263._0_4_ = fVar365 * fVar232;
  auVar263._4_4_ = fVar365 * fVar384;
  auVar263._8_4_ = fVar365 * fVar308;
  auVar263._12_4_ = fVar365 * fVar381;
  auVar343._8_4_ = auVar362._8_4_;
  auVar343._0_8_ = auVar362._0_8_;
  auVar343._12_4_ = auVar362._12_4_;
  auVar235 = minps(auVar343,auVar263);
  auVar194 = maxps(auVar263,auVar362);
  auVar303._0_8_ = CONCAT44(fVar379 * fVar357,fVar393 * fVar357);
  auVar303._8_4_ = fVar394 * fVar357;
  auVar303._12_4_ = fVar395 * fVar357;
  auVar363._0_4_ = fVar357 * fVar308;
  auVar363._4_4_ = fVar357 * fVar381;
  auVar363._8_4_ = fVar357 * fVar313;
  auVar363._12_4_ = fVar357 * fVar191;
  auVar400._8_4_ = auVar303._8_4_;
  auVar400._0_8_ = auVar303._0_8_;
  auVar400._12_4_ = auVar303._12_4_;
  auVar206 = minps(auVar400,auVar363);
  auVar344._0_4_ = fVar401 * fVar233;
  auVar344._4_4_ = fVar402 * fVar310;
  auVar344._8_4_ = fVar403 * fVar329;
  auVar344._12_4_ = fVar404 * fVar332;
  auVar141._0_8_ = CONCAT44(fVar220 * fVar411,fVar219 * fVar410);
  auVar141._8_4_ = fVar231 * fVar218;
  auVar141._12_4_ = fVar255 * fVar216;
  auVar268._0_4_ = fVar233 * fVar410;
  auVar268._4_4_ = fVar310 * fVar411;
  auVar268._8_4_ = fVar329 * fVar218;
  auVar268._12_4_ = fVar332 * fVar216;
  auVar173 = maxps(auVar363,auVar303);
  fVar191 = 1.0 - (auVar173._0_4_ + auVar194._0_4_);
  fVar219 = 0.0 - (auVar173._4_4_ + auVar194._4_4_);
  fVar220 = 0.0 - (auVar173._8_4_ + auVar194._8_4_);
  fVar231 = 0.0 - (auVar173._12_4_ + auVar194._12_4_);
  fVar255 = 1.0 - (auVar206._0_4_ + auVar235._0_4_);
  fVar232 = 0.0 - (auVar206._4_4_ + auVar235._4_4_);
  fVar233 = 0.0 - (auVar206._8_4_ + auVar235._8_4_);
  fVar308 = 0.0 - (auVar206._12_4_ + auVar235._12_4_);
  auVar304._0_8_ = CONCAT44(fVar402 * fVar219,fVar401 * fVar191);
  auVar304._8_4_ = fVar403 * fVar220;
  auVar304._12_4_ = fVar404 * fVar231;
  auVar378._0_4_ = fVar401 * fVar255;
  auVar378._4_4_ = fVar402 * fVar232;
  auVar378._8_4_ = fVar403 * fVar233;
  auVar378._12_4_ = fVar404 * fVar308;
  auVar264._0_8_ = CONCAT44(fVar219 * fVar411,fVar191 * fVar410);
  auVar264._8_4_ = fVar220 * fVar218;
  auVar264._12_4_ = fVar231 * fVar216;
  auVar328._0_4_ = fVar255 * fVar410;
  auVar328._4_4_ = fVar232 * fVar411;
  auVar328._8_4_ = fVar233 * fVar218;
  auVar328._12_4_ = fVar308 * fVar216;
  auVar364._8_4_ = auVar304._8_4_;
  auVar364._0_8_ = auVar304._0_8_;
  auVar364._12_4_ = auVar304._12_4_;
  auVar194 = minps(auVar364,auVar378);
  auVar390._8_4_ = auVar264._8_4_;
  auVar390._0_8_ = auVar264._0_8_;
  auVar390._12_4_ = auVar264._12_4_;
  auVar391 = minps(auVar390,auVar328);
  auVar323 = minps(auVar194,auVar391);
  auVar235 = maxps(auVar378,auVar304);
  auVar194 = maxps(auVar328,auVar264);
  auVar173 = maxps(auVar194,auVar235);
  auVar305._8_4_ = auVar183._8_4_;
  auVar305._0_8_ = auVar183._0_8_;
  auVar305._12_4_ = auVar183._12_4_;
  auVar235 = minps(auVar305,auVar344);
  auVar265._8_4_ = auVar141._8_4_;
  auVar265._0_8_ = auVar141._0_8_;
  auVar265._12_4_ = auVar141._12_4_;
  auVar194 = minps(auVar265,auVar268);
  auVar235 = minps(auVar235,auVar194);
  auVar206 = maxps(auVar344,auVar183);
  auVar194 = maxps(auVar268,auVar141);
  auVar194 = maxps(auVar194,auVar206);
  auVar306._0_4_ = auVar323._4_4_ + auVar323._0_4_ + fVar289;
  auVar306._4_4_ = auVar235._4_4_ + auVar235._0_4_ + fVar266;
  auVar306._8_4_ = auVar323._8_4_ + auVar323._4_4_ + fVar267;
  auVar306._12_4_ = auVar323._12_4_ + auVar235._4_4_ + fVar294;
  fVar191 = auVar173._4_4_ + auVar173._0_4_ + fVar289;
  fVar216 = auVar194._4_4_ + auVar194._0_4_ + fVar266;
  auVar142._4_4_ = fVar216;
  auVar142._0_4_ = fVar191;
  auVar179 = maxps(_local_3f8,auVar306);
  auVar142._8_4_ = auVar173._8_4_ + auVar173._4_4_ + fVar267;
  auVar142._12_4_ = auVar173._12_4_ + auVar194._4_4_ + fVar294;
  auVar194 = minps(auVar142,auVar288);
  iVar150 = -(uint)(auVar194._0_4_ < auVar179._0_4_);
  iVar185 = -(uint)(auVar194._4_4_ < auVar179._4_4_);
  auVar143._4_4_ = iVar185;
  auVar143._0_4_ = iVar150;
  auVar143._8_4_ = iVar185;
  auVar143._12_4_ = iVar185;
  auVar137._8_8_ = auVar143._8_8_;
  auVar137._4_4_ = (float)iVar150;
  auVar137._0_4_ = (float)iVar150;
  iVar150 = movmskpd((uint)(fVar190 < 0.0),auVar137);
  auVar134 = _local_3f8;
  if (iVar150 != 0) goto LAB_0036e763;
  bVar104 = 0;
  if ((fVar147 < auVar306._0_4_) && (fVar191 < fVar148)) {
    bVar104 = -(fVar216 < (float)local_418._4_4_) & (float)local_418._0_4_ < auVar306._4_4_;
  }
  bVar104 = bVar114 | bVar104;
  uVar106 = (ulong)CONCAT31(uVar37,bVar104);
  if (bVar104 != 1) goto LAB_0036e102;
  uVar106 = 0xc9;
  do {
    uVar106 = uVar106 - 1;
    auVar391 = local_b8;
    if (uVar106 == 0) goto LAB_0036e763;
    fVar119 = 1.0 - fVar289;
    fVar216 = fVar289 * fVar289 * fVar289;
    fVar191 = fVar289 * fVar289 * 3.0 * fVar119;
    fVar367 = fVar119 * fVar119 * fVar119;
    fVar218 = fVar289 * 3.0 * fVar119 * fVar119;
    fVar119 = fVar367 * (float)local_2a8 +
              fVar218 * local_2b8 + fVar191 * (float)local_2c8 + fVar216 * local_b8._0_4_;
    fVar147 = fVar367 * local_2a8._4_4_ +
              fVar218 * fStack_2b4 + fVar191 * local_2c8._4_4_ + fVar216 * local_b8._4_4_;
    fVar148 = fVar367 * fStack_2a0 +
              fVar218 * (float)uStack_2b0 + fVar191 * fStack_2c0 + fVar216 * local_b8._8_4_;
    fVar191 = fVar367 * fStack_29c +
              fVar218 * uStack_2b0._4_4_ + fVar191 * fStack_2bc + fVar216 * local_b8._12_4_;
    fVar216 = (fVar148 - fVar119) * fVar266;
    fVar218 = (fVar191 - fVar147) * fVar266;
    fVar367 = (fVar148 - fVar119) * fVar266 + fVar119;
    fVar148 = (fVar191 - fVar147) * fVar266 + fVar147;
    fVar289 = fVar289 - (fVar148 * fVar357 + fVar367 * fVar365);
    fVar266 = fVar266 - (fVar148 * fVar269 + fVar367 * fVar345);
    fVar191 = ABS(fVar148);
    auVar137._0_8_ = CONCAT44(fVar148,fVar367) & 0x7fffffff7fffffff;
    auVar137._8_4_ = ABS(fVar216 + fVar119);
    auVar137._12_4_ = ABS(fVar218 + fVar147);
    auVar179._0_8_ = CONCAT44(fVar148,fVar148) & 0x7fffffff7fffffff;
    auVar179._8_4_ = fVar191;
    auVar179._12_4_ = fVar191;
    if (fVar191 <= ABS(fVar367)) {
      auVar179._0_4_ = ABS(fVar367);
    }
  } while (local_c8 <= auVar179._0_4_);
  if ((((fVar289 < 0.0) || (1.0 < fVar289)) ||
      (auVar179._4_4_ = fVar266, auVar179._0_4_ = fVar266, auVar179._8_4_ = fVar266,
      auVar179._12_4_ = fVar266, fVar266 < 0.0)) || (1.0 < fVar266)) goto LAB_0036e763;
  fVar367 = (pre->ray_space).vx.field_0.m128[2];
  fVar119 = (pre->ray_space).vy.field_0.m128[2];
  fVar147 = (pre->ray_space).vz.field_0.m128[2];
  fVar148 = (ray->org).field_0.m128[0];
  fVar191 = (ray->org).field_0.m128[1];
  fVar216 = (ray->org).field_0.m128[2];
  fVar218 = (ray->org).field_0.m128[3];
  auVar144._0_4_ = (local_388 - fVar148) * fVar367;
  auVar144._4_4_ = (fStack_384 - fVar191) * fVar119;
  auVar144._8_4_ = (fStack_380 - fVar216) * fVar147;
  auVar144._12_4_ = (fStack_37c - fVar218) * 0.0;
  auVar145._8_8_ = auVar144._8_8_;
  auVar145._0_8_ = auVar145._8_8_;
  auVar137._4_12_ = auVar145._4_12_;
  fVar231 = 1.0 - fVar266;
  fVar190 = 1.0 - fVar289;
  fVar219 = fVar190 * fVar190 * fVar190;
  fVar220 = fVar289 * 3.0 * fVar190 * fVar190;
  fVar230 = fVar289 * fVar289 * fVar289;
  fVar229 = fVar289 * fVar289 * 3.0 * fVar190;
  auVar137._0_4_ =
       ((auVar144._8_4_ + auVar144._4_4_ + auVar144._0_4_) * fVar231 +
       ((fStack_370 - fVar216) * fVar147 +
       (fStack_374 - fVar191) * fVar119 + (local_378 - fVar148) * fVar367) * fVar266) * fVar219 +
       (((fStack_390 - fVar216) * fVar147 +
        (fStack_394 - fVar191) * fVar119 + (local_398 - fVar148) * fVar367) * fVar231 +
       ((fStack_360 - fVar216) * fVar147 +
       (fStack_364 - fVar191) * fVar119 + (local_368 - fVar148) * fVar367) * fVar266) * fVar220 +
       (((fStack_3b0 - fVar216) * fVar147 +
        (fStack_3b4 - fVar191) * fVar119 + (local_3b8 - fVar148) * fVar367) * fVar231 +
       ((fStack_3c0 - fVar216) * fVar147 +
       (fStack_3c4 - fVar191) * fVar119 + (local_3c8 - fVar148) * fVar367) * fVar266) * fVar229 +
       (fVar231 * ((fStack_3a0 - fVar216) * fVar147 +
                  (fStack_3a4 - fVar191) * fVar119 + (local_3a8 - fVar148) * fVar367) +
       ((fStack_210 - fVar216) * fVar147 +
       (fStack_214 - fVar191) * fVar119 + (local_218 - fVar148) * fVar367) * fVar266) * fVar230;
  if (auVar137._0_4_ < fVar218) goto LAB_0036e763;
  fVar367 = ray->tfar;
  auVar391 = ZEXT416((uint)fVar367);
  if (fVar367 < auVar137._0_4_) goto LAB_0036e763;
  fVar216 = 1.0 - fVar266;
  fVar218 = 1.0 - fVar266;
  fVar231 = 1.0 - fVar266;
  fVar255 = 1.0 - fVar266;
  fVar119 = local_398 * fVar216 + local_368 * fVar266;
  fVar147 = fStack_394 * fVar218 + fStack_364 * fVar266;
  fVar148 = fStack_390 * fVar231 + fStack_360 * fVar266;
  fVar191 = fStack_38c * fVar255 + fStack_35c * fVar266;
  fVar267 = local_3b8 * fVar216 + local_3c8 * fVar266;
  fVar269 = fStack_3b4 * fVar218 + fStack_3c4 * fVar266;
  fVar365 = fStack_3b0 * fVar231 + fStack_3c0 * fVar266;
  fVar232 = fStack_3ac * fVar255 + fStack_3bc * fVar266;
  fVar357 = fVar267 - fVar119;
  fVar294 = fVar269 - fVar147;
  fVar345 = fVar365 - fVar148;
  fVar233 = fVar232 - fVar191;
  auVar179._4_4_ = fVar289;
  auVar179._0_4_ = fVar289;
  auVar179._8_4_ = fVar289;
  auVar179._12_4_ = fVar289;
  fVar119 = (((fVar119 - (local_388 * fVar216 + local_378 * fVar266)) * fVar190 + fVar289 * fVar357)
             * fVar190 +
            (fVar357 * fVar190 + ((fVar216 * local_3a8 + fVar266 * local_218) - fVar267) * fVar289)
            * fVar289) * 3.0;
  fVar147 = (((fVar147 - (fStack_384 * fVar218 + fStack_374 * fVar266)) * fVar190 +
             fVar289 * fVar294) * fVar190 +
            (fVar294 * fVar190 + ((fVar218 * fStack_3a4 + fVar266 * fStack_214) - fVar269) * fVar289
            ) * fVar289) * 3.0;
  fVar148 = (((fVar148 - (fStack_380 * fVar231 + fStack_370 * fVar266)) * fVar190 +
             fVar289 * fVar345) * fVar190 +
            (fVar345 * fVar190 + ((fVar231 * fStack_3a0 + fVar266 * fStack_210) - fVar365) * fVar289
            ) * fVar289) * 3.0;
  fVar191 = (((fVar191 - (fStack_37c * fVar255 + fStack_36c * fVar266)) * fVar190 +
             fVar289 * fVar233) * fVar190 +
            (fVar233 * fVar190 + ((fVar255 * fStack_39c + fVar266 * fStack_20c) - fVar232) * fVar289
            ) * fVar289) * 3.0;
  pGVar24 = (context->scene->geometries).items[uVar115].ptr;
  if ((pGVar24->mask & ray->mask) != 0) {
    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
       (uVar106 = CONCAT71((int7)((ulong)context->args >> 8),1),
       pGVar24->occlusionFilterN == (RTCFilterFunctionN)0x0)) goto LAB_0036f75b;
    fVar216 = fVar219 * local_198 + fVar220 * local_1a8 + fVar229 * local_1b8 + fVar230 * local_1c8;
    fVar218 = fVar219 * fStack_194 +
              fVar220 * fStack_1a4 + fVar229 * fStack_1b4 + fVar230 * fStack_1c4;
    fVar190 = fVar219 * fStack_190 +
              fVar220 * fStack_1a0 + fVar229 * fStack_1b0 + fVar230 * fStack_1c0;
    fVar219 = fVar219 * fStack_18c +
              fVar220 * fStack_19c + fVar229 * fStack_1ac + fVar230 * fStack_1bc;
    auVar179._0_4_ = fVar218 * fVar119 - fVar147 * fVar216;
    auVar179._4_4_ = fVar190 * fVar147 - fVar148 * fVar218;
    auVar179._8_4_ = fVar216 * fVar148 - fVar119 * fVar190;
    auVar179._12_4_ = fVar219 * fVar191 - fVar191 * fVar219;
    local_1f8 = CONCAT44(auVar179._8_4_,auVar179._4_4_);
    local_1f0 = auVar179._0_4_;
    local_1ec = fVar289;
    fStack_1e8 = fVar266;
    local_1e4 = (int)_local_298;
    local_1e0 = uVar115;
    local_1dc = context->user->instID[0];
    local_1d8 = context->user->instPrimID[0];
    ray->tfar = auVar137._0_4_;
    local_3cc = 0xffffffff;
    local_288.valid = &local_3cc;
    local_288.geometryUserPtr = pGVar24->userPtr;
    local_288.context = context->user;
    local_288.hit = (RTCHitN *)&local_1f8;
    local_288.N = 1;
    local_288.ray = (RTCRayN *)ray;
    if (pGVar24->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_0036f70f:
      p_Var107 = context->args->filter;
      if ((p_Var107 != (RTCFilterFunctionN)0x0) &&
         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
           RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar24->field_8).field_0x2 & 0x40) != 0)))) {
        auVar194 = (*p_Var107)(&local_288);
        auVar179._0_8_ = auVar194._8_8_;
        auVar137._0_8_ = auVar194._0_8_;
        auVar179._8_8_ = extraout_XMM1_Qb_00;
        auVar137._8_8_ = extraout_XMM0_Qb_00;
        p_Var107 = (RTCFilterFunctionN)local_288.valid;
        if (*local_288.valid == 0) goto LAB_0036f74e;
      }
      uVar106 = CONCAT71((int7)((ulong)p_Var107 >> 8),1);
      goto LAB_0036f75b;
    }
    auVar194 = (*pGVar24->occlusionFilterN)(&local_288);
    auVar179._0_8_ = auVar194._8_8_;
    auVar137._0_8_ = auVar194._0_8_;
    auVar179._8_8_ = extraout_XMM1_Qb;
    auVar137._8_8_ = extraout_XMM0_Qb;
    if (*local_288.valid != 0) goto LAB_0036f70f;
LAB_0036f74e:
    auVar137 = ZEXT416((uint)fVar367);
    ray->tfar = fVar367;
  }
  uVar106 = 0;
LAB_0036f75b:
  bVar113 = bVar113 | (byte)uVar106;
  goto LAB_0036e763;
}

Assistant:

static __forceinline bool occluded_n(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          const TensorLinearCubicBezierSurface3fa curve = geom->getNormalOrientedCurve<typename Intersector::SourceCurve3ff, typename Intersector::SourceCurve3fa, TensorLinearCubicBezierSurface3fa>(context, ray.org, primID,ray.time());

          if (Intersector().intersect(pre,ray,context,geom,primID,curve,Epilog(ray,context,geomID,primID)))
              return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }